

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::BSplineCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Primitive PVar12;
  undefined4 uVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined3 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined8 uVar28;
  undefined6 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  byte bVar51;
  ulong uVar52;
  ulong uVar53;
  RTCFilterFunctionN p_Var54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  bool bVar59;
  uint uVar60;
  int iVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  uint uVar65;
  short sVar66;
  undefined2 uVar103;
  float fVar67;
  float fVar104;
  float fVar105;
  vfloat_impl<4> p00;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  float fVar106;
  float fVar130;
  float fVar131;
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar132;
  float fVar143;
  float fVar144;
  vfloat4 v;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar145;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar146;
  float fVar147;
  float fVar155;
  float fVar157;
  vfloat4 v_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar160;
  float fVar172;
  float fVar173;
  vfloat4 a;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar178;
  float fVar204;
  float fVar205;
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar209;
  float fVar210;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar211;
  float fVar212;
  float fVar225;
  float fVar227;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  float fVar226;
  float fVar228;
  float fVar229;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar230;
  float fVar239;
  float fVar240;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar255;
  float fVar258;
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  float fVar256;
  float fVar257;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar276;
  float fVar280;
  vfloat4 a_1;
  undefined1 auVar267 [16];
  undefined1 auVar270 [16];
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar287;
  float fVar298;
  float fVar299;
  vfloat4 a_3;
  float fVar301;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar292 [16];
  float fVar300;
  float fVar302;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar303;
  float fVar304;
  float fVar313;
  float fVar315;
  float fVar317;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar309 [16];
  float fVar314;
  float fVar316;
  float fVar318;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar319;
  float fVar320;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined8 local_3f8;
  undefined4 local_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [16];
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  ulong local_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined8 local_298;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  undefined8 uStack_280;
  ulong local_278;
  Primitive *local_270;
  RTCFilterFunctionNArguments local_268;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  float afStack_1e8 [4];
  undefined8 local_1d8;
  float local_1d0;
  float local_1cc;
  float fStack_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  uint local_1bc;
  uint local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar100 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 uVar102;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  
  PVar12 = prim[1];
  uVar52 = (ulong)(byte)PVar12;
  lVar19 = uVar52 * 0x25;
  pPVar4 = prim + lVar19 + 6;
  fVar144 = *(float *)(pPVar4 + 0xc);
  fVar146 = ((ray->org).field_0.m128[0] - *(float *)pPVar4) * fVar144;
  fVar155 = ((ray->org).field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar144;
  fVar157 = ((ray->org).field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar144;
  fVar132 = fVar144 * (ray->dir).field_0.m128[0];
  fVar143 = fVar144 * (ray->dir).field_0.m128[1];
  fVar144 = fVar144 * (ray->dir).field_0.m128[2];
  uVar13 = *(undefined4 *)(prim + uVar52 * 4 + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar120._8_4_ = 0;
  auVar120._0_8_ = uVar58;
  auVar120._12_2_ = uVar103;
  auVar120._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar134._12_4_ = auVar120._12_4_;
  auVar134._8_2_ = 0;
  auVar134._0_8_ = uVar58;
  auVar134._10_2_ = uVar103;
  auVar68._10_6_ = auVar134._10_6_;
  auVar68._8_2_ = uVar103;
  auVar68._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar30._4_8_ = auVar68._8_8_;
  auVar30._2_2_ = uVar103;
  auVar30._0_2_ = uVar103;
  fVar319 = (float)((int)sVar66 >> 8);
  fVar325 = (float)(auVar30._0_4_ >> 0x18);
  fVar326 = (float)(auVar68._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 5 + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar58;
  auVar109._12_2_ = uVar103;
  auVar109._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar58;
  auVar108._10_2_ = uVar103;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar103;
  auVar107._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar31._4_8_ = auVar107._8_8_;
  auVar31._2_2_ = uVar103;
  auVar31._0_2_ = uVar103;
  fVar160 = (float)((int)sVar66 >> 8);
  fVar172 = (float)(auVar31._0_4_ >> 0x18);
  fVar173 = (float)(auVar107._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 6 + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar58;
  auVar112._12_2_ = uVar103;
  auVar112._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar58;
  auVar111._10_2_ = uVar103;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar103;
  auVar110._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar32._4_8_ = auVar110._8_8_;
  auVar32._2_2_ = uVar103;
  auVar32._0_2_ = uVar103;
  fVar206 = (float)((int)sVar66 >> 8);
  fVar209 = (float)(auVar32._0_4_ >> 0x18);
  fVar210 = (float)(auVar110._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 0xf + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar58;
  auVar115._12_2_ = uVar103;
  auVar115._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar58;
  auVar114._10_2_ = uVar103;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar103;
  auVar113._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar33._4_8_ = auVar113._8_8_;
  auVar33._2_2_ = uVar103;
  auVar33._0_2_ = uVar103;
  fVar67 = (float)((int)sVar66 >> 8);
  fVar104 = (float)(auVar33._0_4_ >> 0x18);
  fVar105 = (float)(auVar113._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar58;
  auVar181._12_2_ = uVar103;
  auVar181._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar58;
  auVar180._10_2_ = uVar103;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar103;
  auVar179._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar34._4_8_ = auVar179._8_8_;
  auVar34._2_2_ = uVar103;
  auVar34._0_2_ = uVar103;
  fVar211 = (float)((int)sVar66 >> 8);
  fVar225 = (float)(auVar34._0_4_ >> 0x18);
  fVar227 = (float)(auVar179._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar52 + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar58;
  auVar184._12_2_ = uVar103;
  auVar184._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar58;
  auVar183._10_2_ = uVar103;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar103;
  auVar182._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar35._4_8_ = auVar182._8_8_;
  auVar35._2_2_ = uVar103;
  auVar35._0_2_ = uVar103;
  fVar241 = (float)((int)sVar66 >> 8);
  fVar255 = (float)(auVar35._0_4_ >> 0x18);
  fVar258 = (float)(auVar182._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 0x1a + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar58;
  auVar187._12_2_ = uVar103;
  auVar187._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar58;
  auVar186._10_2_ = uVar103;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar103;
  auVar185._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar36._4_8_ = auVar185._8_8_;
  auVar36._2_2_ = uVar103;
  auVar36._0_2_ = uVar103;
  fVar230 = (float)((int)sVar66 >> 8);
  fVar239 = (float)(auVar36._0_4_ >> 0x18);
  fVar240 = (float)(auVar185._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 0x1b + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar190._8_4_ = 0;
  auVar190._0_8_ = uVar58;
  auVar190._12_2_ = uVar103;
  auVar190._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar58;
  auVar189._10_2_ = uVar103;
  auVar188._10_6_ = auVar189._10_6_;
  auVar188._8_2_ = uVar103;
  auVar188._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar37._4_8_ = auVar188._8_8_;
  auVar37._2_2_ = uVar103;
  auVar37._0_2_ = uVar103;
  fVar263 = (float)((int)sVar66 >> 8);
  fVar276 = (float)(auVar37._0_4_ >> 0x18);
  fVar280 = (float)(auVar188._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 0x1c + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar58;
  auVar193._12_2_ = uVar103;
  auVar193._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar58;
  auVar192._10_2_ = uVar103;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar103;
  auVar191._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar38._4_8_ = auVar191._8_8_;
  auVar38._2_2_ = uVar103;
  auVar38._0_2_ = uVar103;
  fVar106 = (float)((int)sVar66 >> 8);
  fVar130 = (float)(auVar38._0_4_ >> 0x18);
  fVar131 = (float)(auVar191._8_4_ >> 0x18);
  fVar303 = fVar132 * fVar319 + fVar143 * fVar160 + fVar144 * fVar206;
  fVar313 = fVar132 * fVar325 + fVar143 * fVar172 + fVar144 * fVar209;
  fVar315 = fVar132 * fVar326 + fVar143 * fVar173 + fVar144 * fVar210;
  fVar317 = fVar132 * (float)(auVar134._12_4_ >> 0x18) +
            fVar143 * (float)(auVar108._12_4_ >> 0x18) + fVar144 * (float)(auVar111._12_4_ >> 0x18);
  fVar287 = fVar132 * fVar67 + fVar143 * fVar211 + fVar144 * fVar241;
  fVar298 = fVar132 * fVar104 + fVar143 * fVar225 + fVar144 * fVar255;
  fVar299 = fVar132 * fVar105 + fVar143 * fVar227 + fVar144 * fVar258;
  fVar301 = fVar132 * (float)(auVar114._12_4_ >> 0x18) +
            fVar143 * (float)(auVar180._12_4_ >> 0x18) + fVar144 * (float)(auVar183._12_4_ >> 0x18);
  fVar178 = fVar132 * fVar230 + fVar143 * fVar263 + fVar144 * fVar106;
  fVar204 = fVar132 * fVar239 + fVar143 * fVar276 + fVar144 * fVar130;
  fVar205 = fVar132 * fVar240 + fVar143 * fVar280 + fVar144 * fVar131;
  fVar132 = fVar132 * (float)(auVar186._12_4_ >> 0x18) +
            fVar143 * (float)(auVar189._12_4_ >> 0x18) + fVar144 * (float)(auVar192._12_4_ >> 0x18);
  fVar320 = fVar319 * fVar146 + fVar160 * fVar155 + fVar206 * fVar157;
  fVar325 = fVar325 * fVar146 + fVar172 * fVar155 + fVar209 * fVar157;
  fVar326 = fVar326 * fVar146 + fVar173 * fVar155 + fVar210 * fVar157;
  fVar327 = (float)(auVar134._12_4_ >> 0x18) * fVar146 +
            (float)(auVar108._12_4_ >> 0x18) * fVar155 + (float)(auVar111._12_4_ >> 0x18) * fVar157;
  fVar241 = fVar67 * fVar146 + fVar211 * fVar155 + fVar241 * fVar157;
  fVar255 = fVar104 * fVar146 + fVar225 * fVar155 + fVar255 * fVar157;
  fVar258 = fVar105 * fVar146 + fVar227 * fVar155 + fVar258 * fVar157;
  fVar319 = (float)(auVar114._12_4_ >> 0x18) * fVar146 +
            (float)(auVar180._12_4_ >> 0x18) * fVar155 + (float)(auVar183._12_4_ >> 0x18) * fVar157;
  fVar230 = fVar146 * fVar230 + fVar155 * fVar263 + fVar157 * fVar106;
  fVar239 = fVar146 * fVar239 + fVar155 * fVar276 + fVar157 * fVar130;
  fVar240 = fVar146 * fVar240 + fVar155 * fVar280 + fVar157 * fVar131;
  fVar263 = fVar146 * (float)(auVar186._12_4_ >> 0x18) +
            fVar155 * (float)(auVar189._12_4_ >> 0x18) + fVar157 * (float)(auVar192._12_4_ >> 0x18);
  fVar144 = (float)DAT_01f80d30;
  fVar67 = DAT_01f80d30._4_4_;
  fVar104 = DAT_01f80d30._8_4_;
  fVar105 = DAT_01f80d30._12_4_;
  uVar60 = -(uint)(fVar144 <= ABS(fVar303));
  uVar62 = -(uint)(fVar67 <= ABS(fVar313));
  uVar64 = -(uint)(fVar104 <= ABS(fVar315));
  uVar65 = -(uint)(fVar105 <= ABS(fVar317));
  auVar305._0_4_ = (uint)fVar303 & uVar60;
  auVar305._4_4_ = (uint)fVar313 & uVar62;
  auVar305._8_4_ = (uint)fVar315 & uVar64;
  auVar305._12_4_ = (uint)fVar317 & uVar65;
  auVar148._0_4_ = ~uVar60 & (uint)fVar144;
  auVar148._4_4_ = ~uVar62 & (uint)fVar67;
  auVar148._8_4_ = ~uVar64 & (uint)fVar104;
  auVar148._12_4_ = ~uVar65 & (uint)fVar105;
  auVar148 = auVar148 | auVar305;
  uVar60 = -(uint)(fVar144 <= ABS(fVar287));
  uVar62 = -(uint)(fVar67 <= ABS(fVar298));
  uVar64 = -(uint)(fVar104 <= ABS(fVar299));
  uVar65 = -(uint)(fVar105 <= ABS(fVar301));
  auVar288._0_4_ = (uint)fVar287 & uVar60;
  auVar288._4_4_ = (uint)fVar298 & uVar62;
  auVar288._8_4_ = (uint)fVar299 & uVar64;
  auVar288._12_4_ = (uint)fVar301 & uVar65;
  auVar207._0_4_ = ~uVar60 & (uint)fVar144;
  auVar207._4_4_ = ~uVar62 & (uint)fVar67;
  auVar207._8_4_ = ~uVar64 & (uint)fVar104;
  auVar207._12_4_ = ~uVar65 & (uint)fVar105;
  auVar207 = auVar207 | auVar288;
  uVar60 = -(uint)(fVar144 <= ABS(fVar178));
  uVar62 = -(uint)(fVar67 <= ABS(fVar204));
  uVar64 = -(uint)(fVar104 <= ABS(fVar205));
  uVar65 = -(uint)(fVar105 <= ABS(fVar132));
  auVar194._0_4_ = (uint)fVar178 & uVar60;
  auVar194._4_4_ = (uint)fVar204 & uVar62;
  auVar194._8_4_ = (uint)fVar205 & uVar64;
  auVar194._12_4_ = (uint)fVar132 & uVar65;
  auVar213._0_4_ = ~uVar60 & (uint)fVar144;
  auVar213._4_4_ = ~uVar62 & (uint)fVar67;
  auVar213._8_4_ = ~uVar64 & (uint)fVar104;
  auVar213._12_4_ = ~uVar65 & (uint)fVar105;
  auVar213 = auVar213 | auVar194;
  auVar68 = rcpps(_DAT_01f80d30,auVar148);
  fVar144 = auVar68._0_4_;
  fVar105 = auVar68._4_4_;
  fVar160 = auVar68._8_4_;
  fVar211 = auVar68._12_4_;
  fVar144 = (1.0 - auVar148._0_4_ * fVar144) * fVar144 + fVar144;
  fVar105 = (1.0 - auVar148._4_4_ * fVar105) * fVar105 + fVar105;
  fVar160 = (1.0 - auVar148._8_4_ * fVar160) * fVar160 + fVar160;
  fVar211 = (1.0 - auVar148._12_4_ * fVar211) * fVar211 + fVar211;
  auVar68 = rcpps(auVar68,auVar207);
  fVar67 = auVar68._0_4_;
  fVar106 = auVar68._4_4_;
  fVar172 = auVar68._8_4_;
  fVar225 = auVar68._12_4_;
  fVar67 = (1.0 - auVar207._0_4_ * fVar67) * fVar67 + fVar67;
  fVar106 = (1.0 - auVar207._4_4_ * fVar106) * fVar106 + fVar106;
  fVar172 = (1.0 - auVar207._8_4_ * fVar172) * fVar172 + fVar172;
  fVar225 = (1.0 - auVar207._12_4_ * fVar225) * fVar225 + fVar225;
  auVar68 = rcpps(auVar68,auVar213);
  fVar104 = auVar68._0_4_;
  fVar130 = auVar68._4_4_;
  fVar173 = auVar68._8_4_;
  fVar227 = auVar68._12_4_;
  fVar104 = (1.0 - auVar213._0_4_ * fVar104) * fVar104 + fVar104;
  fVar130 = (1.0 - auVar213._4_4_ * fVar130) * fVar130 + fVar130;
  fVar173 = (1.0 - auVar213._8_4_ * fVar173) * fVar173 + fVar173;
  fVar227 = (1.0 - auVar213._12_4_ * fVar227) * fVar227 + fVar227;
  fVar276 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar19 + 0x16)) *
            *(float *)(prim + lVar19 + 0x1a);
  uVar58 = *(ulong *)(prim + uVar52 * 7 + 6);
  uVar103 = (undefined2)(uVar58 >> 0x30);
  auVar249._8_4_ = 0;
  auVar249._0_8_ = uVar58;
  auVar249._12_2_ = uVar103;
  auVar249._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar58 >> 0x20);
  auVar136._12_4_ = auVar249._12_4_;
  auVar136._8_2_ = 0;
  auVar136._0_8_ = uVar58;
  auVar136._10_2_ = uVar103;
  auVar69._10_6_ = auVar136._10_6_;
  auVar69._8_2_ = uVar103;
  auVar69._0_8_ = uVar58;
  uVar103 = (undefined2)(uVar58 >> 0x10);
  auVar39._4_8_ = auVar69._8_8_;
  auVar39._2_2_ = uVar103;
  auVar39._0_2_ = uVar103;
  fVar131 = (float)(auVar39._0_4_ >> 0x10);
  fVar178 = (float)(auVar69._8_4_ >> 0x10);
  uVar53 = *(ulong *)(prim + uVar52 * 0xb + 6);
  uVar103 = (undefined2)(uVar53 >> 0x30);
  auVar151._8_4_ = 0;
  auVar151._0_8_ = uVar53;
  auVar151._12_2_ = uVar103;
  auVar151._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar53 >> 0x20);
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._8_2_ = 0;
  auVar150._0_8_ = uVar53;
  auVar150._10_2_ = uVar103;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._8_2_ = uVar103;
  auVar149._0_8_ = uVar53;
  uVar103 = (undefined2)(uVar53 >> 0x10);
  auVar40._4_8_ = auVar149._8_8_;
  auVar40._2_2_ = uVar103;
  auVar40._0_2_ = uVar103;
  uVar55 = *(ulong *)(prim + uVar52 * 9 + 6);
  uVar103 = (undefined2)(uVar55 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar55;
  auVar72._12_2_ = uVar103;
  auVar72._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar55 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar55;
  auVar71._10_2_ = uVar103;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar103;
  auVar70._0_8_ = uVar55;
  uVar103 = (undefined2)(uVar55 >> 0x10);
  auVar41._4_8_ = auVar70._8_8_;
  auVar41._2_2_ = uVar103;
  auVar41._0_2_ = uVar103;
  fVar132 = (float)(auVar41._0_4_ >> 0x10);
  fVar204 = (float)(auVar70._8_4_ >> 0x10);
  uVar5 = *(ulong *)(prim + uVar52 * 0xd + 6);
  uVar103 = (undefined2)(uVar5 >> 0x30);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar5;
  auVar216._12_2_ = uVar103;
  auVar216._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar5 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar5;
  auVar215._10_2_ = uVar103;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar103;
  auVar214._0_8_ = uVar5;
  uVar103 = (undefined2)(uVar5 >> 0x10);
  auVar42._4_8_ = auVar214._8_8_;
  auVar42._2_2_ = uVar103;
  auVar42._0_2_ = uVar103;
  uVar6 = *(ulong *)(prim + uVar52 * 0x12 + 6);
  uVar103 = (undefined2)(uVar6 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar6;
  auVar75._12_2_ = uVar103;
  auVar75._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar6 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar6;
  auVar74._10_2_ = uVar103;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar103;
  auVar73._0_8_ = uVar6;
  uVar103 = (undefined2)(uVar6 >> 0x10);
  auVar43._4_8_ = auVar73._8_8_;
  auVar43._2_2_ = uVar103;
  auVar43._0_2_ = uVar103;
  fVar143 = (float)(auVar43._0_4_ >> 0x10);
  fVar205 = (float)(auVar73._8_4_ >> 0x10);
  uVar57 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  uVar7 = *(ulong *)(prim + uVar52 * 2 + uVar57 + 6);
  uVar103 = (undefined2)(uVar7 >> 0x30);
  auVar246._8_4_ = 0;
  auVar246._0_8_ = uVar7;
  auVar246._12_2_ = uVar103;
  auVar246._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar7 >> 0x20);
  auVar245._12_4_ = auVar246._12_4_;
  auVar245._8_2_ = 0;
  auVar245._0_8_ = uVar7;
  auVar245._10_2_ = uVar103;
  auVar244._10_6_ = auVar245._10_6_;
  auVar244._8_2_ = uVar103;
  auVar244._0_8_ = uVar7;
  uVar103 = (undefined2)(uVar7 >> 0x10);
  auVar44._4_8_ = auVar244._8_8_;
  auVar44._2_2_ = uVar103;
  auVar44._0_2_ = uVar103;
  uVar57 = *(ulong *)(prim + uVar57 + 6);
  uVar103 = (undefined2)(uVar57 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar57;
  auVar78._12_2_ = uVar103;
  auVar78._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar57 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar57;
  auVar77._10_2_ = uVar103;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar103;
  auVar76._0_8_ = uVar57;
  uVar103 = (undefined2)(uVar57 >> 0x10);
  auVar45._4_8_ = auVar76._8_8_;
  auVar45._2_2_ = uVar103;
  auVar45._0_2_ = uVar103;
  fVar146 = (float)(auVar45._0_4_ >> 0x10);
  fVar206 = (float)(auVar76._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar52 * 0x18 + 6);
  uVar103 = (undefined2)(uVar8 >> 0x30);
  auVar269._8_4_ = 0;
  auVar269._0_8_ = uVar8;
  auVar269._12_2_ = uVar103;
  auVar269._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar8 >> 0x20);
  auVar268._12_4_ = auVar269._12_4_;
  auVar268._8_2_ = 0;
  auVar268._0_8_ = uVar8;
  auVar268._10_2_ = uVar103;
  auVar267._10_6_ = auVar268._10_6_;
  auVar267._8_2_ = uVar103;
  auVar267._0_8_ = uVar8;
  uVar103 = (undefined2)(uVar8 >> 0x10);
  auVar46._4_8_ = auVar267._8_8_;
  auVar46._2_2_ = uVar103;
  auVar46._0_2_ = uVar103;
  uVar9 = *(ulong *)(prim + uVar52 * 0x1d + 6);
  uVar103 = (undefined2)(uVar9 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar9;
  auVar81._12_2_ = uVar103;
  auVar81._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar9 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar9;
  auVar80._10_2_ = uVar103;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar103;
  auVar79._0_8_ = uVar9;
  uVar103 = (undefined2)(uVar9 >> 0x10);
  auVar47._4_8_ = auVar79._8_8_;
  auVar47._2_2_ = uVar103;
  auVar47._0_2_ = uVar103;
  fVar155 = (float)(auVar47._0_4_ >> 0x10);
  fVar209 = (float)(auVar79._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar52 + (ulong)(byte)PVar12 * 0x20 + 6);
  uVar103 = (undefined2)(uVar10 >> 0x30);
  auVar291._8_4_ = 0;
  auVar291._0_8_ = uVar10;
  auVar291._12_2_ = uVar103;
  auVar291._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar10 >> 0x20);
  auVar290._12_4_ = auVar291._12_4_;
  auVar290._8_2_ = 0;
  auVar290._0_8_ = uVar10;
  auVar290._10_2_ = uVar103;
  auVar289._10_6_ = auVar290._10_6_;
  auVar289._8_2_ = uVar103;
  auVar289._0_8_ = uVar10;
  uVar103 = (undefined2)(uVar10 >> 0x10);
  auVar48._4_8_ = auVar289._8_8_;
  auVar48._2_2_ = uVar103;
  auVar48._0_2_ = uVar103;
  uVar11 = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar52) + 6);
  uVar103 = (undefined2)(uVar11 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar11;
  auVar84._12_2_ = uVar103;
  auVar84._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar11 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar11;
  auVar83._10_2_ = uVar103;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar103;
  auVar82._0_8_ = uVar11;
  uVar103 = (undefined2)(uVar11 >> 0x10);
  auVar49._4_8_ = auVar82._8_8_;
  auVar49._2_2_ = uVar103;
  auVar49._0_2_ = uVar103;
  fVar157 = (float)(auVar49._0_4_ >> 0x10);
  fVar210 = (float)(auVar82._8_4_ >> 0x10);
  uVar52 = *(ulong *)(prim + uVar52 * 0x23 + 6);
  uVar103 = (undefined2)(uVar52 >> 0x30);
  auVar308._8_4_ = 0;
  auVar308._0_8_ = uVar52;
  auVar308._12_2_ = uVar103;
  auVar308._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar52 >> 0x20);
  auVar307._12_4_ = auVar308._12_4_;
  auVar307._8_2_ = 0;
  auVar307._0_8_ = uVar52;
  auVar307._10_2_ = uVar103;
  auVar306._10_6_ = auVar307._10_6_;
  auVar306._8_2_ = uVar103;
  auVar306._0_8_ = uVar52;
  uVar103 = (undefined2)(uVar52 >> 0x10);
  auVar50._4_8_ = auVar306._8_8_;
  auVar50._2_2_ = uVar103;
  auVar50._0_2_ = uVar103;
  auVar152._0_8_ =
       CONCAT44(((((float)(auVar40._0_4_ >> 0x10) - fVar131) * fVar276 + fVar131) - fVar325) *
                fVar105,((((float)(int)(short)uVar53 - (float)(int)(short)uVar58) * fVar276 +
                         (float)(int)(short)uVar58) - fVar320) * fVar144);
  auVar152._8_4_ =
       ((((float)(auVar149._8_4_ >> 0x10) - fVar178) * fVar276 + fVar178) - fVar326) * fVar160;
  auVar152._12_4_ =
       ((((float)(auVar150._12_4_ >> 0x10) - (float)(auVar136._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar136._12_4_ >> 0x10)) - fVar327) * fVar211;
  auVar217._0_4_ =
       ((((float)(int)(short)uVar5 - (float)(int)(short)uVar55) * fVar276 +
        (float)(int)(short)uVar55) - fVar320) * fVar144;
  auVar217._4_4_ =
       ((((float)(auVar42._0_4_ >> 0x10) - fVar132) * fVar276 + fVar132) - fVar325) * fVar105;
  auVar217._8_4_ =
       ((((float)(auVar214._8_4_ >> 0x10) - fVar204) * fVar276 + fVar204) - fVar326) * fVar160;
  auVar217._12_4_ =
       ((((float)(auVar215._12_4_ >> 0x10) - (float)(auVar71._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar71._12_4_ >> 0x10)) - fVar327) * fVar211;
  auVar247._0_8_ =
       CONCAT44(((((float)(auVar44._0_4_ >> 0x10) - fVar143) * fVar276 + fVar143) - fVar255) *
                fVar106,((((float)(int)(short)uVar7 - (float)(int)(short)uVar6) * fVar276 +
                         (float)(int)(short)uVar6) - fVar241) * fVar67);
  auVar247._8_4_ =
       ((((float)(auVar244._8_4_ >> 0x10) - fVar205) * fVar276 + fVar205) - fVar258) * fVar172;
  auVar247._12_4_ =
       ((((float)(auVar245._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar319) * fVar225;
  auVar270._0_4_ =
       ((((float)(int)(short)uVar8 - (float)(int)(short)uVar57) * fVar276 +
        (float)(int)(short)uVar57) - fVar241) * fVar67;
  auVar270._4_4_ =
       ((((float)(auVar46._0_4_ >> 0x10) - fVar146) * fVar276 + fVar146) - fVar255) * fVar106;
  auVar270._8_4_ =
       ((((float)(auVar267._8_4_ >> 0x10) - fVar206) * fVar276 + fVar206) - fVar258) * fVar172;
  auVar270._12_4_ =
       ((((float)(auVar268._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar319) * fVar225;
  auVar292._0_8_ =
       CONCAT44(((((float)(auVar48._0_4_ >> 0x10) - fVar155) * fVar276 + fVar155) - fVar239) *
                fVar130,((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar276 +
                         (float)(int)(short)uVar9) - fVar230) * fVar104);
  auVar292._8_4_ =
       ((((float)(auVar289._8_4_ >> 0x10) - fVar209) * fVar276 + fVar209) - fVar240) * fVar173;
  auVar292._12_4_ =
       ((((float)(auVar290._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar263) * fVar227;
  auVar309._0_4_ =
       ((((float)(int)(short)uVar52 - (float)(int)(short)uVar11) * fVar276 +
        (float)(int)(short)uVar11) - fVar230) * fVar104;
  auVar309._4_4_ =
       ((((float)(auVar50._0_4_ >> 0x10) - fVar157) * fVar276 + fVar157) - fVar239) * fVar130;
  auVar309._8_4_ =
       ((((float)(auVar306._8_4_ >> 0x10) - fVar210) * fVar276 + fVar210) - fVar240) * fVar173;
  auVar309._12_4_ =
       ((((float)(auVar307._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar263) * fVar227;
  auVar133._8_4_ = auVar152._8_4_;
  auVar133._0_8_ = auVar152._0_8_;
  auVar133._12_4_ = auVar152._12_4_;
  auVar134 = minps(auVar133,auVar217);
  auVar85._8_4_ = auVar247._8_4_;
  auVar85._0_8_ = auVar247._0_8_;
  auVar85._12_4_ = auVar247._12_4_;
  auVar68 = minps(auVar85,auVar270);
  auVar134 = maxps(auVar134,auVar68);
  auVar86._8_4_ = auVar292._8_4_;
  auVar86._0_8_ = auVar292._0_8_;
  auVar86._12_4_ = auVar292._12_4_;
  auVar68 = minps(auVar86,auVar309);
  uVar13 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar116._4_4_ = uVar13;
  auVar116._0_4_ = uVar13;
  auVar116._8_4_ = uVar13;
  auVar116._12_4_ = uVar13;
  auVar68 = maxps(auVar68,auVar116);
  auVar68 = maxps(auVar134,auVar68);
  local_168 = auVar68._0_4_ * 0.99999964;
  fStack_164 = auVar68._4_4_ * 0.99999964;
  fStack_160 = auVar68._8_4_ * 0.99999964;
  fStack_15c = auVar68._12_4_ * 0.99999964;
  auVar68 = maxps(auVar152,auVar217);
  auVar134 = maxps(auVar247,auVar270);
  auVar68 = minps(auVar68,auVar134);
  auVar134 = maxps(auVar292,auVar309);
  fVar144 = ray->tfar;
  auVar87._4_4_ = fVar144;
  auVar87._0_4_ = fVar144;
  auVar87._8_4_ = fVar144;
  auVar87._12_4_ = fVar144;
  auVar134 = minps(auVar134,auVar87);
  auVar68 = minps(auVar68,auVar134);
  uVar60 = (uint)(byte)PVar12;
  auVar117._0_4_ = -(uint)(uVar60 != 0 && local_168 <= auVar68._0_4_ * 1.0000004);
  auVar117._4_4_ = -(uint)(1 < uVar60 && fStack_164 <= auVar68._4_4_ * 1.0000004);
  auVar117._8_4_ = -(uint)(2 < uVar60 && fStack_160 <= auVar68._8_4_ * 1.0000004);
  auVar117._12_4_ = -(uint)(3 < uVar60 && fStack_15c <= auVar68._12_4_ * 1.0000004);
  uVar60 = movmskps(uVar60,auVar117);
  if (uVar60 == 0) {
    uVar58 = 0;
LAB_00b12267:
    return (bool)((byte)uVar58 & 1);
  }
  uVar60 = uVar60 & 0xff;
  local_158._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_158._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_158._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_158._12_4_ = 0;
  local_270 = prim;
LAB_00b0fd0c:
  lVar19 = 0;
  if (uVar60 != 0) {
    for (; (uVar60 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
    }
  }
  local_330 = (ulong)*(uint *)(local_270 + 2);
  uVar62 = *(uint *)(local_270 + lVar19 * 4 + 6);
  pGVar14 = (context->scene->geometries).items[local_330].ptr;
  fVar144 = pGVar14->fnumTimeSegments;
  fVar67 = (pGVar14->time_range).lower;
  fVar104 = (((ray->dir).field_0.m128[3] - fVar67) / ((pGVar14->time_range).upper - fVar67)) *
            fVar144;
  fVar67 = floorf(fVar104);
  fVar144 = fVar144 + -1.0;
  if (fVar144 <= fVar67) {
    fVar67 = fVar144;
  }
  fVar144 = 0.0;
  if (0.0 <= fVar67) {
    fVar144 = fVar67;
  }
  fVar104 = fVar104 - fVar144;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                           (ulong)uVar62 *
                           pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar56 = (long)(int)fVar144 * 0x38;
  lVar16 = *(long *)(_Var15 + lVar56);
  lVar17 = *(long *)(_Var15 + 0x10 + lVar56);
  pfVar3 = (float *)(lVar16 + lVar17 * uVar53);
  fVar144 = *pfVar3;
  fVar67 = pfVar3[1];
  fVar105 = pfVar3[2];
  fVar106 = pfVar3[3];
  lVar19 = uVar53 + 1;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar19);
  fVar130 = *pfVar3;
  fVar131 = pfVar3[1];
  fVar132 = pfVar3[2];
  fVar143 = pfVar3[3];
  lVar1 = uVar53 + 2;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar1);
  fVar146 = *pfVar3;
  fVar155 = pfVar3[1];
  fVar157 = pfVar3[2];
  fVar160 = pfVar3[3];
  lVar2 = uVar53 + 3;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar2);
  fVar172 = *pfVar3;
  fVar173 = pfVar3[1];
  fVar178 = pfVar3[2];
  fVar204 = pfVar3[3];
  lVar16 = *(long *)&pGVar14[4].fnumTimeSegments;
  lVar17 = *(long *)(lVar16 + lVar56);
  lVar18 = *(long *)(lVar16 + 0x10 + lVar56);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar53);
  fVar205 = *pfVar3;
  fVar206 = pfVar3[1];
  fVar209 = pfVar3[2];
  fVar210 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar19);
  fVar211 = *pfVar3;
  fVar225 = pfVar3[1];
  fVar227 = pfVar3[2];
  fVar241 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar255 = *pfVar3;
  fVar258 = pfVar3[1];
  fVar319 = pfVar3[2];
  fVar230 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar239 = *pfVar3;
  fVar240 = pfVar3[1];
  fVar263 = pfVar3[2];
  fVar276 = pfVar3[3];
  fVar280 = fVar144 * 0.16666667 + fVar130 * 0.6666667 + fVar146 * 0.16666667 + fVar172 * 0.0;
  fVar287 = fVar67 * 0.16666667 + fVar131 * 0.6666667 + fVar155 * 0.16666667 + fVar173 * 0.0;
  fVar298 = fVar105 * 0.16666667 + fVar132 * 0.6666667 + fVar157 * 0.16666667 + fVar178 * 0.0;
  fVar299 = fVar106 * 0.16666667 + fVar143 * 0.6666667 + fVar160 * 0.16666667 + fVar204 * 0.0;
  fVar317 = ((fVar146 * 0.5 + fVar172 * 0.0) - fVar130 * 0.0) - fVar144 * 0.5;
  fVar325 = ((fVar155 * 0.5 + fVar173 * 0.0) - fVar131 * 0.0) - fVar67 * 0.5;
  fVar327 = ((fVar157 * 0.5 + fVar178 * 0.0) - fVar132 * 0.0) - fVar105 * 0.5;
  fVar145 = ((fVar160 * 0.5 + fVar204 * 0.0) - fVar143 * 0.0) - fVar106 * 0.5;
  fVar304 = fVar205 * 0.16666667 + fVar211 * 0.6666667 + fVar255 * 0.16666667 + fVar239 * 0.0;
  fVar314 = fVar206 * 0.16666667 + fVar225 * 0.6666667 + fVar258 * 0.16666667 + fVar240 * 0.0;
  fVar316 = fVar209 * 0.16666667 + fVar227 * 0.6666667 + fVar319 * 0.16666667 + fVar263 * 0.0;
  fVar318 = fVar210 * 0.16666667 + fVar241 * 0.6666667 + fVar230 * 0.16666667 + fVar276 * 0.0;
  fVar320 = ((fVar255 * 0.5 + fVar239 * 0.0) - fVar211 * 0.0) - fVar205 * 0.5;
  fVar326 = ((fVar258 * 0.5 + fVar240 * 0.0) - fVar225 * 0.0) - fVar206 * 0.5;
  fVar300 = ((fVar319 * 0.5 + fVar263 * 0.0) - fVar227 * 0.0) - fVar209 * 0.5;
  fVar302 = ((fVar230 * 0.5 + fVar276 * 0.0) - fVar241 * 0.0) - fVar210 * 0.5;
  fVar147 = fVar130 * 0.16666667 + fVar146 * 0.6666667 + fVar172 * 0.16666667 + fVar144 * 0.0;
  fVar156 = fVar131 * 0.16666667 + fVar155 * 0.6666667 + fVar173 * 0.16666667 + fVar67 * 0.0;
  fVar158 = fVar132 * 0.16666667 + fVar157 * 0.6666667 + fVar178 * 0.16666667 + fVar105 * 0.0;
  fVar159 = fVar143 * 0.16666667 + fVar160 * 0.6666667 + fVar204 * 0.16666667 + fVar106 * 0.0;
  fVar301 = ((fVar146 * 0.0 + fVar172 * 0.5) - fVar130 * 0.5) - fVar144 * 0.0;
  fVar303 = ((fVar155 * 0.0 + fVar173 * 0.5) - fVar131 * 0.5) - fVar67 * 0.0;
  fVar313 = ((fVar157 * 0.0 + fVar178 * 0.5) - fVar132 * 0.5) - fVar105 * 0.0;
  fVar315 = ((fVar160 * 0.0 + fVar204 * 0.5) - fVar143 * 0.5) - fVar106 * 0.0;
  fVar130 = fVar211 * 0.16666667 + fVar255 * 0.6666667 + fVar239 * 0.16666667 + fVar205 * 0.0;
  fVar131 = fVar225 * 0.16666667 + fVar258 * 0.6666667 + fVar240 * 0.16666667 + fVar206 * 0.0;
  fVar132 = fVar227 * 0.16666667 + fVar319 * 0.6666667 + fVar263 * 0.16666667 + fVar209 * 0.0;
  fVar146 = fVar241 * 0.16666667 + fVar230 * 0.6666667 + fVar276 * 0.16666667 + fVar210 * 0.0;
  fVar144 = ((fVar255 * 0.0 + fVar239 * 0.5) - fVar211 * 0.5) - fVar205 * 0.0;
  fVar67 = ((fVar258 * 0.0 + fVar240 * 0.5) - fVar225 * 0.5) - fVar206 * 0.0;
  fVar105 = ((fVar319 * 0.0 + fVar263 * 0.5) - fVar227 * 0.5) - fVar209 * 0.0;
  fVar106 = ((fVar230 * 0.0 + fVar276 * 0.5) - fVar241 * 0.5) - fVar210 * 0.0;
  fVar211 = fVar325 * fVar304 - fVar314 * fVar317;
  fVar227 = fVar327 * fVar314 - fVar316 * fVar325;
  fVar241 = fVar317 * fVar316 - fVar304 * fVar327;
  fVar255 = fVar145 * fVar318 - fVar318 * fVar145;
  fVar172 = fVar325 * fVar320 - fVar326 * fVar317;
  fVar178 = fVar327 * fVar326 - fVar300 * fVar325;
  fVar204 = fVar317 * fVar300 - fVar320 * fVar327;
  fVar143 = fVar303 * fVar130 - fVar131 * fVar301;
  fVar155 = fVar313 * fVar131 - fVar132 * fVar303;
  fVar157 = fVar301 * fVar132 - fVar130 * fVar313;
  fVar160 = fVar315 * fVar146 - fVar146 * fVar315;
  fVar130 = fVar303 * fVar144 - fVar67 * fVar301;
  fVar131 = fVar313 * fVar67 - fVar105 * fVar303;
  fVar105 = fVar301 * fVar105 - fVar144 * fVar313;
  fVar206 = fVar241 * fVar241 + fVar227 * fVar227 + fVar211 * fVar211;
  auVar134 = ZEXT416((uint)fVar206);
  auVar68 = rsqrtss(ZEXT416((uint)fVar206),auVar134);
  fVar144 = auVar68._0_4_;
  fVar209 = fVar144 * 1.5 - fVar144 * fVar144 * fVar206 * 0.5 * fVar144;
  fVar225 = fVar211 * fVar172 + fVar241 * fVar204 + fVar227 * fVar178;
  fVar144 = fVar255 * fVar209;
  auVar68 = rcpss(auVar134,auVar134);
  fVar173 = (2.0 - fVar206 * auVar68._0_4_) * auVar68._0_4_;
  fVar205 = fVar157 * fVar157 + fVar155 * fVar155 + fVar143 * fVar143;
  auVar68 = ZEXT416((uint)fVar205);
  auVar134 = rsqrtss(ZEXT416((uint)fVar205),auVar68);
  fVar67 = auVar134._0_4_;
  fVar146 = fVar67 * 1.5 - fVar67 * fVar67 * fVar205 * 0.5 * fVar67;
  fVar210 = fVar143 * fVar130 + fVar157 * fVar105 + fVar155 * fVar131;
  fVar132 = fVar160 * fVar146;
  auVar68 = rcpss(auVar68,auVar68);
  fVar67 = (2.0 - fVar205 * auVar68._0_4_) * auVar68._0_4_;
  fVar212 = fVar299 * fVar227 * fVar209;
  fVar226 = fVar299 * fVar241 * fVar209;
  fVar228 = fVar299 * fVar211 * fVar209;
  fVar229 = fVar299 * fVar144;
  fVar264 = fVar280 - fVar212;
  fVar277 = fVar287 - fVar226;
  fVar281 = fVar298 - fVar228;
  fVar284 = fVar299 - fVar229;
  fVar242 = fVar299 * fVar173 * (fVar206 * fVar178 - fVar225 * fVar227) * fVar209 +
            fVar145 * fVar227 * fVar209;
  fVar256 = fVar299 * fVar173 * (fVar206 * fVar204 - fVar225 * fVar241) * fVar209 +
            fVar145 * fVar241 * fVar209;
  fVar259 = fVar299 * fVar173 * (fVar206 * fVar172 - fVar225 * fVar211) * fVar209 +
            fVar145 * fVar211 * fVar209;
  fVar261 = fVar299 * fVar173 * (fVar206 * (fVar145 * fVar302 - fVar302 * fVar145) -
                                fVar225 * fVar255) * fVar209 + fVar145 * fVar144;
  fVar212 = fVar212 + fVar280;
  fVar226 = fVar226 + fVar287;
  fVar228 = fVar228 + fVar298;
  fVar229 = fVar229 + fVar299;
  fVar280 = fVar159 * fVar155 * fVar146;
  fVar287 = fVar159 * fVar157 * fVar146;
  fVar298 = fVar159 * fVar143 * fVar146;
  fVar299 = fVar159 * fVar132;
  fVar304 = fVar147 - fVar280;
  fVar316 = fVar156 - fVar287;
  fVar174 = fVar158 - fVar298;
  fVar176 = fVar159 - fVar299;
  fVar320 = fVar159 * fVar67 * (fVar205 * fVar131 - fVar210 * fVar155) * fVar146 +
            fVar315 * fVar155 * fVar146;
  fVar326 = fVar159 * fVar67 * (fVar205 * fVar105 - fVar210 * fVar157) * fVar146 +
            fVar315 * fVar157 * fVar146;
  fVar300 = fVar159 * fVar67 * (fVar205 * fVar130 - fVar210 * fVar143) * fVar146 +
            fVar315 * fVar143 * fVar146;
  fVar302 = fVar159 * fVar67 * (fVar205 * (fVar315 * fVar106 - fVar106 * fVar315) -
                               fVar210 * fVar160) * fVar146 + fVar315 * fVar132;
  fVar280 = fVar280 + fVar147;
  fVar287 = fVar287 + fVar156;
  fVar298 = fVar298 + fVar158;
  fVar299 = fVar299 + fVar159;
  lVar17 = *(long *)(_Var15 + 0x38 + lVar56);
  lVar18 = *(long *)(_Var15 + 0x48 + lVar56);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar53);
  fVar144 = *pfVar3;
  fVar67 = pfVar3[1];
  fVar105 = pfVar3[2];
  fVar106 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar19);
  fVar130 = *pfVar3;
  fVar131 = pfVar3[1];
  fVar132 = pfVar3[2];
  fVar143 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar146 = *pfVar3;
  fVar155 = pfVar3[1];
  fVar157 = pfVar3[2];
  fVar160 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar172 = *pfVar3;
  fVar173 = pfVar3[1];
  fVar178 = pfVar3[2];
  fVar204 = pfVar3[3];
  lVar17 = *(long *)(lVar16 + 0x38 + lVar56);
  lVar16 = *(long *)(lVar16 + 0x48 + lVar56);
  uVar53 = uVar53 * lVar16;
  fVar265 = fVar144 * 0.16666667 + fVar130 * 0.6666667 + fVar146 * 0.16666667 + fVar172 * 0.0;
  fVar278 = fVar67 * 0.16666667 + fVar131 * 0.6666667 + fVar155 * 0.16666667 + fVar173 * 0.0;
  fVar282 = fVar105 * 0.16666667 + fVar132 * 0.6666667 + fVar157 * 0.16666667 + fVar178 * 0.0;
  fVar285 = fVar106 * 0.16666667 + fVar143 * 0.6666667 + fVar160 * 0.16666667 + fVar204 * 0.0;
  fVar147 = ((fVar146 * 0.5 + fVar172 * 0.0) - fVar130 * 0.0) - fVar144 * 0.5;
  fVar156 = ((fVar155 * 0.5 + fVar173 * 0.0) - fVar131 * 0.0) - fVar67 * 0.5;
  fVar158 = ((fVar157 * 0.5 + fVar178 * 0.0) - fVar132 * 0.0) - fVar105 * 0.5;
  fVar159 = ((fVar160 * 0.5 + fVar204 * 0.0) - fVar143 * 0.0) - fVar106 * 0.5;
  pfVar3 = (float *)(lVar17 + lVar16 * lVar2);
  fVar205 = *pfVar3;
  fVar206 = pfVar3[1];
  fVar209 = pfVar3[2];
  fVar210 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar1 * lVar16);
  fVar211 = *pfVar3;
  fVar225 = pfVar3[1];
  fVar227 = pfVar3[2];
  fVar241 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar19 * lVar16);
  fVar255 = *pfVar3;
  fVar258 = pfVar3[1];
  fVar319 = pfVar3[2];
  fVar230 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + uVar53);
  fVar239 = *pfVar3;
  fVar240 = pfVar3[1];
  fVar263 = pfVar3[2];
  fVar276 = pfVar3[3];
  fVar266 = fVar239 * 0.16666667 + fVar255 * 0.6666667 + fVar211 * 0.16666667 + fVar205 * 0.0;
  fVar279 = fVar240 * 0.16666667 + fVar258 * 0.6666667 + fVar225 * 0.16666667 + fVar206 * 0.0;
  fVar283 = fVar263 * 0.16666667 + fVar319 * 0.6666667 + fVar227 * 0.16666667 + fVar209 * 0.0;
  fVar286 = fVar276 * 0.16666667 + fVar230 * 0.6666667 + fVar241 * 0.16666667 + fVar210 * 0.0;
  fVar243 = ((fVar211 * 0.5 + fVar205 * 0.0) - fVar255 * 0.0) - fVar239 * 0.5;
  fVar257 = ((fVar225 * 0.5 + fVar206 * 0.0) - fVar258 * 0.0) - fVar240 * 0.5;
  fVar260 = ((fVar227 * 0.5 + fVar209 * 0.0) - fVar319 * 0.0) - fVar263 * 0.5;
  fVar262 = ((fVar241 * 0.5 + fVar210 * 0.0) - fVar230 * 0.0) - fVar276 * 0.5;
  fVar314 = fVar130 * 0.16666667 + fVar146 * 0.6666667 + fVar172 * 0.16666667 + fVar144 * 0.0;
  fVar318 = fVar131 * 0.16666667 + fVar155 * 0.6666667 + fVar173 * 0.16666667 + fVar67 * 0.0;
  fVar175 = fVar132 * 0.16666667 + fVar157 * 0.6666667 + fVar178 * 0.16666667 + fVar105 * 0.0;
  fVar177 = fVar143 * 0.16666667 + fVar160 * 0.6666667 + fVar204 * 0.16666667 + fVar106 * 0.0;
  fVar144 = ((fVar146 * 0.0 + fVar172 * 0.5) - fVar130 * 0.5) - fVar144 * 0.0;
  fVar67 = ((fVar155 * 0.0 + fVar173 * 0.5) - fVar131 * 0.5) - fVar67 * 0.0;
  fVar105 = ((fVar157 * 0.0 + fVar178 * 0.5) - fVar132 * 0.5) - fVar105 * 0.0;
  fVar106 = ((fVar160 * 0.0 + fVar204 * 0.5) - fVar143 * 0.5) - fVar106 * 0.0;
  fVar146 = fVar255 * 0.16666667 + fVar211 * 0.6666667 + fVar205 * 0.16666667 + fVar239 * 0.0;
  fVar155 = fVar258 * 0.16666667 + fVar225 * 0.6666667 + fVar206 * 0.16666667 + fVar240 * 0.0;
  fVar157 = fVar319 * 0.16666667 + fVar227 * 0.6666667 + fVar209 * 0.16666667 + fVar263 * 0.0;
  fVar204 = fVar230 * 0.16666667 + fVar241 * 0.6666667 + fVar210 * 0.16666667 + fVar276 * 0.0;
  fVar130 = ((fVar211 * 0.0 + fVar205 * 0.5) - fVar255 * 0.5) - fVar239 * 0.0;
  fVar131 = ((fVar225 * 0.0 + fVar206 * 0.5) - fVar258 * 0.5) - fVar240 * 0.0;
  fVar132 = ((fVar227 * 0.0 + fVar209 * 0.5) - fVar319 * 0.5) - fVar263 * 0.0;
  fVar160 = ((fVar241 * 0.0 + fVar210 * 0.5) - fVar230 * 0.5) - fVar276 * 0.0;
  fVar178 = fVar156 * fVar266 - fVar279 * fVar147;
  fVar225 = fVar158 * fVar279 - fVar283 * fVar156;
  fVar241 = fVar147 * fVar283 - fVar266 * fVar158;
  fVar258 = fVar159 * fVar286 - fVar286 * fVar159;
  fVar143 = fVar156 * fVar243 - fVar257 * fVar147;
  fVar172 = fVar158 * fVar257 - fVar260 * fVar156;
  fVar173 = fVar147 * fVar260 - fVar243 * fVar158;
  fVar211 = fVar67 * fVar146 - fVar155 * fVar144;
  fVar227 = fVar105 * fVar155 - fVar157 * fVar67;
  fVar255 = fVar144 * fVar157 - fVar146 * fVar105;
  fVar319 = fVar106 * fVar204 - fVar204 * fVar106;
  fVar146 = fVar67 * fVar130 - fVar131 * fVar144;
  fVar155 = fVar105 * fVar131 - fVar132 * fVar67;
  fVar157 = fVar144 * fVar132 - fVar130 * fVar105;
  fVar130 = fVar241 * fVar241 + fVar225 * fVar225 + fVar178 * fVar178;
  auVar68 = ZEXT416((uint)fVar130);
  auVar134 = rsqrtss(ZEXT416((uint)fVar130),auVar68);
  fVar131 = auVar134._0_4_;
  fVar204 = fVar131 * 1.5 - fVar131 * fVar131 * fVar130 * 0.5 * fVar131;
  fVar230 = fVar178 * fVar143 + fVar241 * fVar173 + fVar225 * fVar172;
  auVar68 = rcpss(auVar68,auVar68);
  fVar131 = (2.0 - fVar130 * auVar68._0_4_) * auVar68._0_4_;
  fVar132 = fVar258 * fVar204;
  fVar240 = fVar255 * fVar255 + fVar227 * fVar227 + fVar211 * fVar211;
  auVar68 = ZEXT416((uint)fVar240);
  auVar134 = rsqrtss(ZEXT416((uint)fVar240),auVar68);
  fVar205 = auVar134._0_4_;
  fVar276 = fVar205 * 1.5 - fVar205 * fVar205 * fVar240 * 0.5 * fVar205;
  fVar243 = fVar211 * fVar146 + fVar255 * fVar157 + fVar227 * fVar155;
  auVar68 = rcpss(auVar68,auVar68);
  fVar257 = (2.0 - fVar240 * auVar68._0_4_) * auVar68._0_4_;
  fVar263 = fVar319 * fVar276;
  fVar205 = fVar285 * fVar225 * fVar204;
  fVar206 = fVar285 * fVar241 * fVar204;
  fVar209 = fVar285 * fVar178 * fVar204;
  fVar210 = fVar285 * fVar132;
  fVar172 = fVar285 * fVar131 * (fVar130 * fVar172 - fVar230 * fVar225) * fVar204 +
            fVar159 * fVar225 * fVar204;
  fVar173 = fVar285 * fVar131 * (fVar130 * fVar173 - fVar230 * fVar241) * fVar204 +
            fVar159 * fVar241 * fVar204;
  fVar178 = fVar285 * fVar131 * (fVar130 * fVar143 - fVar230 * fVar178) * fVar204 +
            fVar159 * fVar178 * fVar204;
  fVar204 = fVar285 * fVar131 * (fVar130 * (fVar159 * fVar262 - fVar262 * fVar159) -
                                fVar230 * fVar258) * fVar204 + fVar159 * fVar132;
  fVar225 = fVar265 - fVar205;
  fVar241 = fVar278 - fVar206;
  fVar258 = fVar282 - fVar209;
  fVar230 = fVar285 - fVar210;
  fVar205 = fVar205 + fVar265;
  fVar206 = fVar206 + fVar278;
  fVar209 = fVar209 + fVar282;
  fVar210 = fVar210 + fVar285;
  fVar130 = fVar177 * fVar227 * fVar276;
  fVar131 = fVar177 * fVar255 * fVar276;
  fVar132 = fVar177 * fVar211 * fVar276;
  fVar143 = fVar177 * fVar263;
  fVar227 = fVar177 * fVar257 * (fVar240 * fVar155 - fVar243 * fVar227) * fVar276 +
            fVar106 * fVar227 * fVar276;
  fVar255 = fVar177 * fVar257 * (fVar240 * fVar157 - fVar243 * fVar255) * fVar276 +
            fVar106 * fVar255 * fVar276;
  fVar239 = fVar177 * fVar257 * (fVar240 * fVar146 - fVar243 * fVar211) * fVar276 +
            fVar106 * fVar211 * fVar276;
  fVar319 = fVar177 * fVar257 * (fVar240 * (fVar106 * fVar160 - fVar160 * fVar106) -
                                fVar243 * fVar319) * fVar276 + fVar106 * fVar263;
  fVar146 = fVar314 - fVar130;
  fVar155 = fVar318 - fVar131;
  fVar157 = fVar175 - fVar132;
  fVar160 = fVar177 - fVar143;
  fVar130 = fVar130 + fVar314;
  fVar131 = fVar131 + fVar318;
  fVar132 = fVar132 + fVar175;
  fVar143 = fVar143 + fVar177;
  fVar211 = 1.0 - fVar104;
  local_368 = fVar264 * fVar211 + fVar225 * fVar104;
  fStack_364 = fVar277 * fVar211 + fVar241 * fVar104;
  fStack_360 = fVar281 * fVar211 + fVar258 * fVar104;
  fStack_35c = fVar284 * fVar211 + fVar230 * fVar104;
  local_378 = ((fVar317 - fVar242) * 0.33333334 + fVar264) * fVar211 +
              ((fVar147 - fVar172) * 0.33333334 + fVar225) * fVar104;
  fStack_374 = ((fVar325 - fVar256) * 0.33333334 + fVar277) * fVar211 +
               ((fVar156 - fVar173) * 0.33333334 + fVar241) * fVar104;
  fStack_370 = ((fVar327 - fVar259) * 0.33333334 + fVar281) * fVar211 +
               ((fVar158 - fVar178) * 0.33333334 + fVar258) * fVar104;
  fStack_36c = ((fVar145 - fVar261) * 0.33333334 + fVar284) * fVar211 +
               ((fVar159 - fVar204) * 0.33333334 + fVar230) * fVar104;
  local_398 = (fVar304 - (fVar301 - fVar320) * 0.33333334) * fVar211 +
              (fVar146 - (fVar144 - fVar227) * 0.33333334) * fVar104;
  fStack_394 = (fVar316 - (fVar303 - fVar326) * 0.33333334) * fVar211 +
               (fVar155 - (fVar67 - fVar255) * 0.33333334) * fVar104;
  fStack_390 = (fVar174 - (fVar313 - fVar300) * 0.33333334) * fVar211 +
               (fVar157 - (fVar105 - fVar239) * 0.33333334) * fVar104;
  fStack_38c = (fVar176 - (fVar315 - fVar302) * 0.33333334) * fVar211 +
               (fVar160 - (fVar106 - fVar319) * 0.33333334) * fVar104;
  local_388 = fVar304 * fVar211 + fVar146 * fVar104;
  fStack_384 = fVar316 * fVar211 + fVar155 * fVar104;
  fStack_380 = fVar174 * fVar211 + fVar157 * fVar104;
  fStack_37c = fVar176 * fVar211 + fVar160 * fVar104;
  local_358 = fVar212 * fVar211 + fVar205 * fVar104;
  fStack_354 = fVar226 * fVar211 + fVar206 * fVar104;
  fStack_350 = fVar228 * fVar211 + fVar209 * fVar104;
  fStack_34c = fVar229 * fVar211 + fVar210 * fVar104;
  local_348 = ((fVar242 + fVar317) * 0.33333334 + fVar212) * fVar211 +
              ((fVar172 + fVar147) * 0.33333334 + fVar205) * fVar104;
  fStack_344 = ((fVar256 + fVar325) * 0.33333334 + fVar226) * fVar211 +
               ((fVar173 + fVar156) * 0.33333334 + fVar206) * fVar104;
  fStack_340 = ((fVar259 + fVar327) * 0.33333334 + fVar228) * fVar211 +
               ((fVar178 + fVar158) * 0.33333334 + fVar209) * fVar104;
  fStack_33c = ((fVar261 + fVar145) * 0.33333334 + fVar229) * fVar211 +
               ((fVar204 + fVar159) * 0.33333334 + fVar210) * fVar104;
  local_3b8 = (fVar280 - (fVar320 + fVar301) * 0.33333334) * fVar211 +
              (fVar130 - (fVar227 + fVar144) * 0.33333334) * fVar104;
  fStack_3b4 = (fVar287 - (fVar326 + fVar303) * 0.33333334) * fVar211 +
               (fVar131 - (fVar255 + fVar67) * 0.33333334) * fVar104;
  fStack_3b0 = (fVar298 - (fVar300 + fVar313) * 0.33333334) * fVar211 +
               (fVar132 - (fVar239 + fVar105) * 0.33333334) * fVar104;
  fStack_3ac = (fVar299 - (fVar302 + fVar315) * 0.33333334) * fVar211 +
               (fVar143 - (fVar319 + fVar106) * 0.33333334) * fVar104;
  local_208 = fVar211 * fVar280 + fVar104 * fVar130;
  fStack_204 = fVar211 * fVar287 + fVar104 * fVar131;
  fStack_200 = fVar211 * fVar298 + fVar104 * fVar132;
  fStack_1fc = fVar211 * fVar299 + fVar104 * fVar143;
  fVar144 = (ray->org).field_0.m128[0];
  fVar67 = (ray->org).field_0.m128[1];
  fVar104 = (ray->org).field_0.m128[2];
  fVar105 = (pre->ray_space).vx.field_0.m128[0];
  fVar106 = (pre->ray_space).vx.field_0.m128[1];
  fVar130 = (pre->ray_space).vy.field_0.m128[0];
  fVar131 = (pre->ray_space).vy.field_0.m128[1];
  fVar132 = (pre->ray_space).vz.field_0.m128[0];
  fVar143 = (pre->ray_space).vz.field_0.m128[1];
  fVar172 = (local_368 - fVar144) * fVar105 +
            (fStack_364 - fVar67) * fVar130 + (fStack_360 - fVar104) * fVar132;
  fVar173 = (local_368 - fVar144) * fVar106 +
            (fStack_364 - fVar67) * fVar131 + (fStack_360 - fVar104) * fVar143;
  local_2a8 = CONCAT44(fVar173,fVar172);
  fVar205 = (local_378 - fVar144) * fVar105 +
            (fStack_374 - fVar67) * fVar130 + (fStack_370 - fVar104) * fVar132;
  fVar206 = (local_378 - fVar144) * fVar106 +
            (fStack_374 - fVar67) * fVar131 + (fStack_370 - fVar104) * fVar143;
  local_2b8 = CONCAT44(fVar206,fVar205);
  fVar157 = (local_398 - fVar144) * fVar105 +
            (fStack_394 - fVar67) * fVar130 + (fStack_390 - fVar104) * fVar132;
  fVar160 = (local_398 - fVar144) * fVar106 +
            (fStack_394 - fVar67) * fVar131 + (fStack_390 - fVar104) * fVar143;
  local_2c8 = CONCAT44(fVar160,fVar157);
  fVar146 = (local_388 - fVar144) * fVar105 +
            (fStack_384 - fVar67) * fVar130 + (fStack_380 - fVar104) * fVar132;
  fVar155 = (local_388 - fVar144) * fVar106 +
            (fStack_384 - fVar67) * fVar131 + (fStack_380 - fVar104) * fVar143;
  local_2d8 = CONCAT44(fVar155,fVar146);
  local_2e8 = (local_358 - fVar144) * fVar105 +
              (fStack_354 - fVar67) * fVar130 + (fStack_350 - fVar104) * fVar132;
  fStack_2e4 = (local_358 - fVar144) * fVar106 +
               (fStack_354 - fVar67) * fVar131 + (fStack_350 - fVar104) * fVar143;
  fVar178 = (local_348 - fVar144) * fVar105 +
            (fStack_344 - fVar67) * fVar130 + (fStack_340 - fVar104) * fVar132;
  fVar204 = (local_348 - fVar144) * fVar106 +
            (fStack_344 - fVar67) * fVar131 + (fStack_340 - fVar104) * fVar143;
  local_2f8 = CONCAT44(fVar204,fVar178);
  local_308 = (local_3b8 - fVar144) * fVar105 +
              (fStack_3b4 - fVar67) * fVar130 + (fStack_3b0 - fVar104) * fVar132;
  fStack_304 = (local_3b8 - fVar144) * fVar106 +
               (fStack_3b4 - fVar67) * fVar131 + (fStack_3b0 - fVar104) * fVar143;
  fVar105 = (local_208 - fVar144) * fVar105 +
            (fStack_204 - fVar67) * fVar130 + (fStack_200 - fVar104) * fVar132;
  fVar67 = (local_208 - fVar144) * fVar106 +
           (fStack_204 - fVar67) * fVar131 + (fStack_200 - fVar104) * fVar143;
  local_318 = CONCAT44(fVar67,fVar105);
  auVar293._8_8_ = local_2f8;
  auVar293._0_8_ = local_2b8;
  auVar231._8_8_ = local_318;
  auVar231._0_8_ = local_2d8;
  auVar88._8_4_ = local_2e8;
  auVar88._0_8_ = local_2a8;
  auVar88._12_4_ = fStack_2e4;
  auVar68 = minps(auVar88,auVar293);
  auVar118._8_4_ = local_308;
  auVar118._0_8_ = local_2c8;
  auVar118._12_4_ = fStack_304;
  auVar134 = minps(auVar118,auVar231);
  auVar68 = minps(auVar68,auVar134);
  auVar119._4_4_ = fVar173;
  auVar119._0_4_ = fVar172;
  auVar119._8_4_ = local_2e8;
  auVar119._12_4_ = fStack_2e4;
  auVar134 = maxps(auVar119,auVar293);
  auVar135._4_4_ = fVar160;
  auVar135._0_4_ = fVar157;
  auVar135._8_4_ = local_308;
  auVar135._12_4_ = fStack_304;
  auVar136 = maxps(auVar135,auVar231);
  auVar120 = maxps(auVar134,auVar136);
  auVar20._4_8_ = auVar136._8_8_;
  auVar20._0_4_ = auVar68._4_4_;
  auVar137._0_8_ = auVar20._0_8_ << 0x20;
  auVar137._8_4_ = auVar68._8_4_;
  auVar137._12_4_ = auVar68._12_4_;
  auVar138._8_8_ = auVar68._8_8_;
  auVar138._0_8_ = auVar137._8_8_;
  auVar134 = minps(auVar68,auVar138);
  auVar21._4_8_ = auVar68._8_8_;
  auVar21._0_4_ = auVar120._4_4_;
  auVar139._0_8_ = auVar21._0_8_ << 0x20;
  auVar139._8_4_ = auVar120._8_4_;
  auVar139._12_4_ = auVar120._12_4_;
  auVar140._8_8_ = auVar120._8_8_;
  auVar140._0_8_ = auVar139._8_8_;
  auVar68 = maxps(auVar120,auVar140);
  auVar89._0_8_ = auVar134._0_8_ & 0x7fffffff7fffffff;
  auVar89._8_4_ = auVar134._8_4_ & 0x7fffffff;
  auVar89._12_4_ = auVar134._12_4_ & 0x7fffffff;
  auVar121._0_8_ = auVar68._0_8_ & 0x7fffffff7fffffff;
  auVar121._8_4_ = auVar68._8_4_ & 0x7fffffff;
  auVar121._12_4_ = auVar68._12_4_ & 0x7fffffff;
  auVar68 = maxps(auVar89,auVar121);
  fVar144 = auVar68._4_4_;
  if (auVar68._4_4_ <= auVar68._0_4_) {
    fVar144 = auVar68._0_4_;
  }
  fVar144 = fVar144 * 9.536743e-07;
  register0x00001488 = local_2a8;
  register0x000015c8 = local_2b8;
  register0x000013c8 = local_2c8;
  register0x00001388 = local_2d8;
  register0x00001588 = local_2f8;
  register0x00001348 = local_318;
  local_138 = fVar144;
  fStack_134 = fVar144;
  fStack_130 = fVar144;
  fStack_12c = fVar144;
  local_148 = -fVar144;
  fStack_144 = -fVar144;
  fStack_140 = -fVar144;
  fStack_13c = -fVar144;
  afStack_1e8[0] = local_2e8;
  afStack_1e8[1] = fStack_2e4;
  local_88 = fVar205 - fVar172;
  fStack_84 = fVar206 - fVar173;
  fStack_80 = fVar178 - local_2e8;
  fStack_7c = fVar204 - fStack_2e4;
  local_98 = fVar157 - fVar205;
  fStack_94 = fVar160 - fVar206;
  fStack_90 = local_308 - fVar178;
  fStack_8c = fStack_304 - fVar204;
  fStack_284 = fStack_304;
  local_288 = local_308;
  uStack_280 = local_2f8;
  local_a8 = fVar146 - fVar157;
  fStack_a4 = fVar155 - fVar160;
  fStack_a0 = fVar105 - local_308;
  fStack_9c = fVar67 - fStack_304;
  local_178 = local_358 - local_368;
  fStack_174 = fStack_354 - fStack_364;
  fStack_170 = fStack_350 - fStack_360;
  fStack_16c = fStack_34c - fStack_35c;
  local_188 = local_348 - local_378;
  fStack_184 = fStack_344 - fStack_374;
  fStack_180 = fStack_340 - fStack_370;
  fStack_17c = fStack_33c - fStack_36c;
  local_198 = local_3b8 - local_398;
  fStack_194 = fStack_3b4 - fStack_394;
  fStack_190 = fStack_3b0 - fStack_390;
  fStack_18c = fStack_3ac - fStack_38c;
  local_1a8 = local_208 - local_388;
  fStack_1a4 = fStack_204 - fStack_384;
  fStack_1a0 = fStack_200 - fStack_380;
  fStack_19c = fStack_1fc - fStack_37c;
  uVar58 = 0;
  uVar55 = 0;
  local_418._4_4_ = 0.0;
  fStack_40c = 1.0;
  local_418._0_4_ = 0.0;
  fStack_410 = 1.0;
  fStack_300 = local_308;
  fStack_2fc = fStack_304;
  fStack_2e0 = local_2e8;
  fStack_2dc = fStack_2e4;
  local_298 = local_2c8;
  local_278 = (ulong)uVar62;
  local_1f8 = local_2a8;
LAB_00b10ac6:
  do {
    fVar104 = 1.0 - (float)local_418._4_4_;
    fVar106 = 1.0 - (float)local_418._4_4_;
    fVar130 = 1.0 - fStack_40c;
    fVar131 = 1.0 - fStack_40c;
    fVar211 = local_2a8._0_4_ * fVar104 + local_2e8 * (float)local_418._4_4_;
    fVar319 = local_2a8._4_4_ * fVar106 + fStack_2e4 * (float)local_418._4_4_;
    fVar230 = local_2a8._8_4_ * fVar130 + fStack_2e0 * fStack_40c;
    fVar239 = local_2a8._12_4_ * fVar131 + fStack_2dc * fStack_40c;
    fVar132 = local_2b8._0_4_ * fVar104 + local_2f8._0_4_ * (float)local_418._4_4_;
    fVar241 = local_2b8._4_4_ * fVar106 + local_2f8._4_4_ * (float)local_418._4_4_;
    fVar255 = local_2b8._8_4_ * fVar130 + local_2f8._8_4_ * fStack_40c;
    fVar258 = local_2b8._12_4_ * fVar131 + local_2f8._12_4_ * fStack_40c;
    fVar276 = local_2c8._0_4_ * fVar104 + local_308 * (float)local_418._4_4_;
    fVar280 = local_2c8._4_4_ * fVar106 + fStack_304 * (float)local_418._4_4_;
    fVar320 = local_2c8._8_4_ * fVar130 + fStack_300 * fStack_40c;
    fVar325 = local_2c8._12_4_ * fVar131 + fStack_2fc * fStack_40c;
    fVar240 = fVar104 * local_2d8._0_4_ + (float)local_418._4_4_ * local_318._0_4_;
    fVar263 = fVar106 * local_2d8._4_4_ + (float)local_418._4_4_ * local_318._4_4_;
    fVar299 = fVar130 * local_2d8._8_4_ + fStack_40c * local_318._8_4_;
    fVar301 = fVar131 * local_2d8._12_4_ + fStack_40c * local_318._12_4_;
    fVar303 = (fStack_410 - (float)local_418._0_4_) * 0.11111111;
    local_3f8 = CONCAT44(fStack_410,local_418._0_4_);
    fVar313 = (fStack_410 - (float)local_418._0_4_) * 0.0 + (float)local_418._0_4_;
    fVar315 = (fStack_410 - (float)local_418._0_4_) * 0.33333334 + (float)local_418._0_4_;
    fVar317 = (fStack_410 - (float)local_418._0_4_) * 0.6666667 + (float)local_418._0_4_;
    local_418._0_4_ = (fStack_410 - (float)local_418._0_4_) * 1.0 + (float)local_418._0_4_;
    fVar106 = 1.0 - fVar313;
    fVar131 = 1.0 - fVar315;
    fVar143 = 1.0 - fVar317;
    fVar157 = 1.0 - (float)local_418._0_4_;
    fVar172 = fVar132 * fVar106 + fVar276 * fVar313;
    fVar173 = fVar132 * fVar131 + fVar276 * fVar315;
    fVar178 = fVar132 * fVar143 + fVar276 * fVar317;
    fVar204 = fVar132 * fVar157 + fVar276 * (float)local_418._0_4_;
    fVar205 = fVar241 * fVar106 + fVar280 * fVar313;
    fVar206 = fVar241 * fVar131 + fVar280 * fVar315;
    fVar209 = fVar241 * fVar143 + fVar280 * fVar317;
    fVar210 = fVar241 * fVar157 + fVar280 * (float)local_418._0_4_;
    fVar160 = (fVar211 * fVar106 + fVar132 * fVar313) * fVar106 + fVar313 * fVar172;
    fVar104 = (fVar211 * fVar131 + fVar132 * fVar315) * fVar131 + fVar315 * fVar173;
    fVar130 = (fVar211 * fVar143 + fVar132 * fVar317) * fVar143 + fVar317 * fVar178;
    fVar132 = (fVar211 * fVar157 + fVar132 * (float)local_418._0_4_) * fVar157 +
              (float)local_418._0_4_ * fVar204;
    fVar211 = (fVar319 * fVar106 + fVar241 * fVar313) * fVar106 + fVar313 * fVar205;
    fVar225 = (fVar319 * fVar131 + fVar241 * fVar315) * fVar131 + fVar315 * fVar206;
    fVar227 = (fVar319 * fVar143 + fVar241 * fVar317) * fVar143 + fVar317 * fVar209;
    fVar241 = (fVar319 * fVar157 + fVar241 * (float)local_418._0_4_) * fVar157 +
              (float)local_418._0_4_ * fVar210;
    fVar172 = fVar172 * fVar106 + (fVar276 * fVar106 + fVar240 * fVar313) * fVar313;
    fVar173 = fVar173 * fVar131 + (fVar276 * fVar131 + fVar240 * fVar315) * fVar315;
    fVar178 = fVar178 * fVar143 + (fVar276 * fVar143 + fVar240 * fVar317) * fVar317;
    fVar204 = fVar204 * fVar157 +
              (fVar276 * fVar157 + fVar240 * (float)local_418._0_4_) * (float)local_418._0_4_;
    fVar205 = fVar205 * fVar106 + (fVar280 * fVar106 + fVar263 * fVar313) * fVar313;
    fVar206 = fVar206 * fVar131 + (fVar280 * fVar131 + fVar263 * fVar315) * fVar315;
    fVar209 = fVar209 * fVar143 + (fVar280 * fVar143 + fVar263 * fVar317) * fVar317;
    fVar210 = fVar210 * fVar157 +
              (fVar280 * fVar157 + fVar263 * (float)local_418._0_4_) * (float)local_418._0_4_;
    local_238 = fVar106 * fVar160 + fVar313 * fVar172;
    fStack_234 = fVar131 * fVar104 + fVar315 * fVar173;
    fStack_230 = fVar143 * fVar130 + fVar317 * fVar178;
    fStack_22c = fVar157 * fVar132 + (float)local_418._0_4_ * fVar204;
    local_128 = fVar106 * fVar211 + fVar313 * fVar205;
    fStack_124 = fVar131 * fVar225 + fVar315 * fVar206;
    fStack_120 = fVar143 * fVar227 + fVar317 * fVar209;
    fStack_11c = fVar157 * fVar241 + (float)local_418._0_4_ * fVar210;
    fVar173 = (fVar173 - fVar104) * 3.0 * fVar303;
    fVar178 = (fVar178 - fVar130) * 3.0 * fVar303;
    fVar204 = (fVar204 - fVar132) * 3.0 * fVar303;
    fVar104 = (fVar206 - fVar225) * 3.0 * fVar303;
    fVar130 = (fVar209 - fVar227) * 3.0 * fVar303;
    fVar132 = (fVar210 - fVar241) * 3.0 * fVar303;
    local_3a8._4_4_ = fStack_230;
    local_3a8._0_4_ = fStack_234;
    local_3a8._8_4_ = fStack_22c;
    local_3a8._12_4_ = 0;
    local_c8._4_4_ = fStack_120;
    local_c8._0_4_ = fStack_124;
    local_218 = local_238 + (fVar172 - fVar160) * 3.0 * fVar303;
    fStack_214 = fStack_234 + fVar173;
    fStack_210 = fStack_230 + fVar178;
    fStack_20c = fStack_22c + fVar204;
    local_328._0_4_ = local_128 + (fVar205 - fVar211) * 3.0 * fVar303;
    local_328._4_4_ = fStack_124 + fVar104;
    fStack_320 = fStack_120 + fVar130;
    fStack_31c = fStack_11c + fVar132;
    local_228._0_4_ = fStack_234 - fVar173;
    local_228._4_4_ = fStack_230 - fVar178;
    local_228._8_4_ = fStack_22c - fVar204;
    local_228._12_4_ = 0;
    fVar104 = fStack_124 - fVar104;
    fVar130 = fStack_120 - fVar130;
    fVar132 = fStack_11c - fVar132;
    fVar160 = fVar255 * fVar106 + fVar320 * fVar313;
    fVar172 = fVar255 * fVar131 + fVar320 * fVar315;
    fVar173 = fVar255 * fVar143 + fVar320 * fVar317;
    fVar178 = fVar255 * fVar157 + fVar320 * (float)local_418._0_4_;
    fVar204 = fVar258 * fVar106 + fVar325 * fVar313;
    fVar205 = fVar258 * fVar131 + fVar325 * fVar315;
    fVar206 = fVar258 * fVar143 + fVar325 * fVar317;
    fVar209 = fVar258 * fVar157 + fVar325 * (float)local_418._0_4_;
    fVar210 = (fVar230 * fVar106 + fVar255 * fVar313) * fVar106 + fVar313 * fVar160;
    fVar211 = (fVar230 * fVar131 + fVar255 * fVar315) * fVar131 + fVar315 * fVar172;
    fVar225 = (fVar230 * fVar143 + fVar255 * fVar317) * fVar143 + fVar317 * fVar173;
    fVar227 = (fVar230 * fVar157 + fVar255 * (float)local_418._0_4_) * fVar157 +
              (float)local_418._0_4_ * fVar178;
    fVar276 = (fVar239 * fVar106 + fVar258 * fVar313) * fVar106 + fVar313 * fVar204;
    fVar280 = (fVar239 * fVar131 + fVar258 * fVar315) * fVar131 + fVar315 * fVar205;
    fVar287 = (fVar239 * fVar143 + fVar258 * fVar317) * fVar143 + fVar317 * fVar206;
    fVar298 = (fVar239 * fVar157 + fVar258 * (float)local_418._0_4_) * fVar157 +
              (float)local_418._0_4_ * fVar209;
    fVar241 = fVar160 * fVar106 + (fVar320 * fVar106 + fVar299 * fVar313) * fVar313;
    fVar255 = fVar172 * fVar131 + (fVar320 * fVar131 + fVar299 * fVar315) * fVar315;
    fVar258 = fVar173 * fVar143 + (fVar320 * fVar143 + fVar299 * fVar317) * fVar317;
    fVar319 = fVar178 * fVar157 +
              (fVar320 * fVar157 + fVar299 * (float)local_418._0_4_) * (float)local_418._0_4_;
    fVar230 = fVar204 * fVar106 + (fVar325 * fVar106 + fVar301 * fVar313) * fVar313;
    fVar239 = fVar205 * fVar131 + (fVar325 * fVar131 + fVar301 * fVar315) * fVar315;
    fVar240 = fVar206 * fVar143 + (fVar325 * fVar143 + fVar301 * fVar317) * fVar317;
    fVar263 = fVar209 * fVar157 +
              (fVar325 * fVar157 + fVar301 * (float)local_418._0_4_) * (float)local_418._0_4_;
    fVar204 = fVar106 * fVar210 + fVar313 * fVar241;
    fVar205 = fVar131 * fVar211 + fVar315 * fVar255;
    fVar206 = fVar143 * fVar225 + fVar317 * fVar258;
    fVar209 = fVar157 * fVar227 + (float)local_418._0_4_ * fVar319;
    fVar160 = fVar106 * fVar276 + fVar313 * fVar230;
    fVar172 = fVar131 * fVar280 + fVar315 * fVar239;
    fVar173 = fVar143 * fVar287 + fVar317 * fVar240;
    fVar178 = fVar157 * fVar298 + (float)local_418._0_4_ * fVar263;
    fVar106 = (fVar255 - fVar211) * 3.0 * fVar303;
    fVar131 = (fVar258 - fVar225) * 3.0 * fVar303;
    fVar143 = (fVar319 - fVar227) * 3.0 * fVar303;
    fVar157 = (fVar239 - fVar280) * 3.0 * fVar303;
    fVar211 = (fVar240 - fVar287) * 3.0 * fVar303;
    fVar225 = (fVar263 - fVar298) * 3.0 * fVar303;
    local_d8._4_4_ = fVar206;
    local_d8._0_4_ = fVar205;
    local_d8._8_4_ = fVar209;
    local_d8._12_4_ = 0;
    local_f8._4_4_ = fVar173;
    local_f8._0_4_ = fVar172;
    local_f8._8_4_ = fVar178;
    local_f8._12_4_ = 0;
    local_118 = fVar204 + (fVar241 - fVar210) * 3.0 * fVar303;
    fStack_114 = fVar205 + fVar106;
    fStack_110 = fVar206 + fVar131;
    fStack_10c = fVar209 + fVar143;
    local_e8 = fVar160 + (fVar230 - fVar276) * 3.0 * fVar303;
    fStack_e4 = fVar172 + fVar157;
    fStack_e0 = fVar173 + fVar211;
    fStack_dc = fVar178 + fVar225;
    local_b8._0_4_ = fVar205 - fVar106;
    local_b8._4_4_ = fVar206 - fVar131;
    local_b8._8_4_ = fVar209 - fVar143;
    local_b8._12_4_ = 0;
    local_108._0_4_ = fVar172 - fVar157;
    local_108._4_4_ = fVar173 - fVar211;
    local_108._8_4_ = fVar178 - fVar225;
    local_108._12_4_ = 0;
    fVar106 = (fVar205 - fStack_234) + (fVar204 - local_238);
    fVar131 = (fVar206 - fStack_230) + (fVar205 - fStack_234);
    fVar143 = (fVar209 - fStack_22c) + (fVar206 - fStack_230);
    fVar157 = (fVar209 - fStack_22c) + 0.0;
    local_c8._8_4_ = fStack_11c;
    local_c8._12_4_ = 0;
    fVar210 = (fVar172 - fStack_124) + (fVar160 - local_128);
    fVar211 = (fVar173 - fStack_120) + (fVar172 - fStack_124);
    fVar225 = (fVar178 - fStack_11c) + (fVar173 - fStack_120);
    fVar227 = (fVar178 - fStack_11c) + 0.0;
    auVar218._0_8_ =
         CONCAT44(fStack_124 * fVar131 - fStack_234 * fVar211,
                  local_128 * fVar106 - local_238 * fVar210);
    auVar218._8_4_ = fStack_120 * fVar143 - fStack_230 * fVar225;
    auVar218._12_4_ = fStack_11c * fVar157 - fStack_22c * fVar227;
    auVar161._0_4_ = (float)local_328._0_4_ * fVar106 - local_218 * fVar210;
    auVar161._4_4_ = (float)local_328._4_4_ * fVar131 - fStack_214 * fVar211;
    auVar161._8_4_ = fStack_320 * fVar143 - fStack_210 * fVar225;
    auVar161._12_4_ = fStack_31c * fVar157 - fStack_20c * fVar227;
    auVar195._0_8_ =
         CONCAT44(fVar130 * fVar131 - fVar211 * local_228._4_4_,
                  fVar104 * fVar106 - fVar210 * local_228._0_4_);
    auVar195._8_4_ = fVar132 * fVar143 - fVar225 * local_228._8_4_;
    auVar195._12_4_ = fVar157 * 0.0 - fVar227 * 0.0;
    auVar310._0_4_ = fVar106 * fStack_124 - fVar210 * fStack_234;
    auVar310._4_4_ = fVar131 * fStack_120 - fVar211 * fStack_230;
    auVar310._8_4_ = fVar143 * fStack_11c - fVar225 * fStack_22c;
    auVar310._12_4_ = fVar157 * 0.0 - fVar227 * 0.0;
    auVar248._0_8_ =
         CONCAT44(fVar172 * fVar131 - fVar205 * fVar211,fVar160 * fVar106 - fVar204 * fVar210);
    auVar248._8_4_ = fVar173 * fVar143 - fVar206 * fVar225;
    auVar248._12_4_ = fVar178 * fVar157 - fVar209 * fVar227;
    auVar324._0_4_ = local_e8 * fVar106 - local_118 * fVar210;
    auVar324._4_4_ = fStack_e4 * fVar131 - fStack_114 * fVar211;
    auVar324._8_4_ = fStack_e0 * fVar143 - fStack_110 * fVar225;
    auVar324._12_4_ = fStack_dc * fVar157 - fStack_10c * fVar227;
    auVar232._0_8_ =
         CONCAT44(local_108._4_4_ * fVar131 - fVar211 * local_b8._4_4_,
                  local_108._0_4_ * fVar106 - fVar210 * local_b8._0_4_);
    auVar232._8_4_ = local_108._8_4_ * fVar143 - fVar225 * local_b8._8_4_;
    auVar232._12_4_ = fVar157 * 0.0 - fVar227 * 0.0;
    auVar90._0_4_ = fVar106 * fVar172 - fVar210 * fVar205;
    auVar90._4_4_ = fVar131 * fVar173 - fVar211 * fVar206;
    auVar90._8_4_ = fVar143 * fVar178 - fVar225 * fVar209;
    auVar90._12_4_ = fVar157 * 0.0 - fVar227 * 0.0;
    auVar122._8_4_ = auVar218._8_4_;
    auVar122._0_8_ = auVar218._0_8_;
    auVar122._12_4_ = auVar218._12_4_;
    auVar68 = minps(auVar122,auVar161);
    auVar120 = maxps(auVar218,auVar161);
    auVar162._8_4_ = auVar195._8_4_;
    auVar162._0_8_ = auVar195._0_8_;
    auVar162._12_4_ = auVar195._12_4_;
    auVar134 = minps(auVar162,auVar310);
    auVar68 = minps(auVar68,auVar134);
    auVar134 = maxps(auVar195,auVar310);
    auVar136 = maxps(auVar120,auVar134);
    auVar163._8_4_ = auVar248._8_4_;
    auVar163._0_8_ = auVar248._0_8_;
    auVar163._12_4_ = auVar248._12_4_;
    auVar134 = minps(auVar163,auVar324);
    auVar249 = maxps(auVar248,auVar324);
    auVar196._8_4_ = auVar232._8_4_;
    auVar196._0_8_ = auVar232._0_8_;
    auVar196._12_4_ = auVar232._12_4_;
    auVar120 = minps(auVar196,auVar90);
    auVar134 = minps(auVar134,auVar120);
    auVar68 = minps(auVar68,auVar134);
    auVar134 = maxps(auVar232,auVar90);
    auVar134 = maxps(auVar249,auVar134);
    auVar134 = maxps(auVar136,auVar134);
    auVar219._0_4_ =
         -(uint)(local_148 <= auVar134._0_4_ && auVar68._0_4_ <= local_138) & local_158._0_4_;
    auVar219._4_4_ =
         -(uint)(fStack_144 <= auVar134._4_4_ && auVar68._4_4_ <= fStack_134) & local_158._4_4_;
    auVar219._8_4_ =
         -(uint)(fStack_140 <= auVar134._8_4_ && auVar68._8_4_ <= fStack_130) & local_158._8_4_;
    auVar219._12_4_ =
         -(uint)(fStack_13c <= auVar134._12_4_ && auVar68._12_4_ <= fStack_12c) & local_158._12_4_;
    uVar62 = movmskps((int)uVar53,auVar219);
    uVar53 = (ulong)uVar62;
    if (uVar62 != 0) {
      fVar106 = (fVar205 - fVar204) + (fStack_234 - local_238);
      fVar131 = (fVar206 - fVar205) + (fStack_230 - fStack_234);
      fVar143 = (fVar209 - fVar206) + (fStack_22c - fStack_230);
      fVar157 = (0.0 - fVar209) + (0.0 - fStack_22c);
      fVar210 = (fVar172 - fVar160) + (fStack_124 - local_128);
      fVar211 = (fVar173 - fVar172) + (fStack_120 - fStack_124);
      fVar225 = (fVar178 - fVar173) + (fStack_11c - fStack_120);
      fVar227 = (0.0 - fVar178) + (0.0 - fStack_11c);
      auVar328._0_8_ =
           CONCAT44(fStack_124 * fVar131 - fStack_234 * fVar211,
                    local_128 * fVar106 - local_238 * fVar210);
      auVar328._8_4_ = fStack_120 * fVar143 - fStack_230 * fVar225;
      auVar328._12_4_ = fStack_11c * fVar157 - fStack_22c * fVar227;
      auVar164._0_4_ = (float)local_328._0_4_ * fVar106 - local_218 * fVar210;
      auVar164._4_4_ = (float)local_328._4_4_ * fVar131 - fStack_214 * fVar211;
      auVar164._8_4_ = fStack_320 * fVar143 - fStack_210 * fVar225;
      auVar164._12_4_ = fStack_31c * fVar157 - fStack_20c * fVar227;
      auVar233._0_8_ =
           CONCAT44(fVar130 * fVar131 - local_228._4_4_ * fVar211,
                    fVar104 * fVar106 - local_228._0_4_ * fVar210);
      auVar233._8_4_ = fVar132 * fVar143 - local_228._8_4_ * fVar225;
      auVar233._12_4_ = fVar157 * 0.0 - fVar227 * 0.0;
      auVar197._0_4_ = fStack_124 * fVar106 - fStack_234 * fVar210;
      auVar197._4_4_ = fStack_120 * fVar131 - fStack_230 * fVar211;
      auVar197._8_4_ = fStack_11c * fVar143 - fStack_22c * fVar225;
      auVar197._12_4_ = fVar157 * 0.0 - fVar227 * 0.0;
      auVar141._0_8_ =
           CONCAT44(fVar172 * fVar131 - fVar205 * fVar211,fVar160 * fVar106 - fVar204 * fVar210);
      auVar141._8_4_ = fVar173 * fVar143 - fVar206 * fVar225;
      auVar141._12_4_ = fVar178 * fVar157 - fVar209 * fVar227;
      auVar271._0_4_ = local_e8 * fVar106 - local_118 * fVar210;
      auVar271._4_4_ = fStack_e4 * fVar131 - fStack_114 * fVar211;
      auVar271._8_4_ = fStack_e0 * fVar143 - fStack_110 * fVar225;
      auVar271._12_4_ = fStack_dc * fVar157 - fStack_10c * fVar227;
      auVar311._0_8_ =
           CONCAT44(local_108._4_4_ * fVar131 - local_b8._4_4_ * fVar211,
                    local_108._0_4_ * fVar106 - local_b8._0_4_ * fVar210);
      auVar311._8_4_ = local_108._8_4_ * fVar143 - local_b8._8_4_ * fVar225;
      auVar311._12_4_ = fVar157 * 0.0 - fVar227 * 0.0;
      auVar91._0_4_ = fVar106 * fVar172 - fVar210 * fVar205;
      auVar91._4_4_ = fVar131 * fVar173 - fVar211 * fVar206;
      auVar91._8_4_ = fVar143 * fVar178 - fVar225 * fVar209;
      auVar91._12_4_ = fVar157 * 0.0 - fVar227 * 0.0;
      auVar123._8_4_ = auVar328._8_4_;
      auVar123._0_8_ = auVar328._0_8_;
      auVar123._12_4_ = auVar328._12_4_;
      auVar68 = minps(auVar123,auVar164);
      auVar120 = maxps(auVar328,auVar164);
      auVar165._8_4_ = auVar233._8_4_;
      auVar165._0_8_ = auVar233._0_8_;
      auVar165._12_4_ = auVar233._12_4_;
      auVar134 = minps(auVar165,auVar197);
      auVar68 = minps(auVar68,auVar134);
      auVar134 = maxps(auVar233,auVar197);
      auVar249 = maxps(auVar120,auVar134);
      auVar166._8_4_ = auVar141._8_4_;
      auVar166._0_8_ = auVar141._0_8_;
      auVar166._12_4_ = auVar141._12_4_;
      auVar120 = minps(auVar166,auVar271);
      auVar134 = maxps(auVar141,auVar271);
      auVar198._8_4_ = auVar311._8_4_;
      auVar198._0_8_ = auVar311._0_8_;
      auVar198._12_4_ = auVar311._12_4_;
      auVar136 = minps(auVar198,auVar91);
      auVar120 = minps(auVar120,auVar136);
      auVar68 = minps(auVar68,auVar120);
      auVar120 = maxps(auVar311,auVar91);
      auVar134 = maxps(auVar134,auVar120);
      auVar134 = maxps(auVar249,auVar134);
      auVar329._0_4_ =
           -(uint)(local_148 <= auVar134._0_4_ && auVar68._0_4_ <= local_138) & auVar219._0_4_;
      auVar329._4_4_ =
           -(uint)(fStack_144 <= auVar134._4_4_ && auVar68._4_4_ <= fStack_134) & auVar219._4_4_;
      auVar329._8_4_ =
           -(uint)(fStack_140 <= auVar134._8_4_ && auVar68._8_4_ <= fStack_130) & auVar219._8_4_;
      auVar329._12_4_ =
           -(uint)(fStack_13c <= auVar134._12_4_ && auVar68._12_4_ <= fStack_12c) & auVar219._12_4_;
      uVar62 = movmskps(uVar62,auVar329);
      uVar53 = (ulong)uVar62;
      auVar324 = local_f8;
      if (uVar62 != 0) {
        uVar53 = (ulong)(byte)uVar62;
        afStack_1e8[uVar55] = (float)(uVar62 & 0xff);
        *(undefined8 *)(afStack_78 + uVar55 * 2) = local_3f8;
        *(ulong *)(afStack_58 + uVar55 * 2) = CONCAT44(fStack_40c,local_418._4_4_);
        uVar55 = (ulong)((int)uVar55 + 1);
      }
    }
LAB_00b11138:
    if ((int)uVar55 == 0) {
      if ((uVar58 & 1) != 0) goto LAB_00b12267;
      fVar144 = ray->tfar;
      auVar129._4_4_ = -(uint)(fStack_164 <= fVar144);
      auVar129._0_4_ = -(uint)(local_168 <= fVar144);
      auVar129._8_4_ = -(uint)(fStack_160 <= fVar144);
      auVar129._12_4_ = -(uint)(fStack_15c <= fVar144);
      uVar62 = movmskps((int)uVar53,auVar129);
      uVar60 = uVar60 & uVar60 + 0xf & uVar62;
      if (uVar60 != 0) goto LAB_00b0fd0c;
      goto LAB_00b12267;
    }
    uVar62 = (int)uVar55 - 1;
    uVar53 = (ulong)uVar62;
    fVar104 = afStack_1e8[uVar53];
    local_418._4_4_ = afStack_58[uVar53 * 2];
    fStack_40c = afStack_58[uVar53 * 2 + 1];
    uVar5 = 0;
    if (fVar104 != 0.0) {
      for (; ((uint)fVar104 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    fVar104 = (float)((int)fVar104 - 1U & (uint)fVar104);
    afStack_1e8[uVar53] = fVar104;
    if (fVar104 == 0.0) {
      uVar55 = (ulong)uVar62;
    }
    fVar130 = (float)(uVar5 + 1) * 0.33333334;
    fVar104 = afStack_78[uVar53 * 2];
    fVar106 = afStack_78[uVar53 * 2 + 1];
    local_418._0_4_ =
         fVar104 * (1.0 - (float)uVar5 * 0.33333334) + fVar106 * (float)uVar5 * 0.33333334;
    fStack_410 = fVar104 * (1.0 - fVar130) + fVar106 * fVar130;
    fVar130 = fVar104 * 0.0 + fVar106 * 0.0;
    fVar106 = fVar104 * 0.0 + fVar106 * 0.0;
    fVar104 = fStack_410 - (float)local_418._0_4_;
    if (fVar104 < 0.16666667) {
      fVar204 = 1.0 - (float)local_418._4_4_;
      fVar205 = 1.0 - (float)local_418._4_4_;
      fVar206 = 1.0 - fStack_40c;
      fVar209 = 1.0 - fStack_40c;
      fVar131 = (float)local_2a8._0_4_ * fVar204 + local_2e8 * (float)local_418._4_4_;
      fVar132 = (float)local_2a8._4_4_ * fVar205 + fStack_2e4 * (float)local_418._4_4_;
      fVar143 = fStack_2a0 * fVar206 + fStack_2e0 * fStack_40c;
      fVar157 = fStack_29c * fVar209 + fStack_2dc * fStack_40c;
      fVar160 = (float)local_2b8._0_4_ * fVar204 + (float)local_2f8._0_4_ * (float)local_418._4_4_;
      fVar172 = (float)local_2b8._4_4_ * fVar205 + (float)local_2f8._4_4_ * (float)local_418._4_4_;
      fVar173 = fStack_2b0 * fVar206 + fStack_2f0 * fStack_40c;
      fVar178 = fStack_2ac * fVar209 + fStack_2ec * fStack_40c;
      fVar230 = (float)local_2c8._0_4_ * fVar204 + local_308 * (float)local_418._4_4_;
      fVar240 = (float)local_2c8._4_4_ * fVar205 + fStack_304 * (float)local_418._4_4_;
      fVar276 = fStack_2c0 * fVar206 + fStack_300 * fStack_40c;
      fVar287 = fStack_2bc * fVar209 + fStack_2fc * fStack_40c;
      fVar241 = (fVar204 * (float)local_2d8._0_4_ + (float)local_418._4_4_ * (float)local_318._0_4_)
                - fVar230;
      fVar255 = (fVar205 * (float)local_2d8._4_4_ + (float)local_418._4_4_ * (float)local_318._4_4_)
                - fVar240;
      fVar258 = (fVar206 * fStack_2d0 + fStack_40c * fStack_310) - fVar276;
      fVar319 = (fVar209 * fStack_2cc + fStack_40c * fStack_30c) - fVar287;
      fVar210 = (float)local_418._0_4_ * (fVar230 - fVar160) + fVar160;
      fVar211 = (float)local_418._0_4_ * (fVar240 - fVar172) + fVar172;
      fVar225 = (float)local_418._0_4_ * (fVar276 - fVar173) + fVar173;
      fVar227 = (float)local_418._0_4_ * (fVar287 - fVar178) + fVar178;
      fVar239 = (fVar230 - fVar160) * fStack_410 + fVar160;
      fVar263 = (fVar240 - fVar172) * fStack_410 + fVar172;
      fVar280 = (fVar276 - fVar173) * fStack_410 + fVar173;
      fVar298 = (fVar287 - fVar178) * fStack_410 + fVar178;
      fVar204 = (float)local_418._0_4_ * (fVar160 - fVar131) + fVar131;
      fVar205 = (float)local_418._0_4_ * (fVar172 - fVar132) + fVar132;
      fVar206 = (float)local_418._0_4_ * (fVar173 - fVar143) + fVar143;
      fVar209 = (float)local_418._0_4_ * (fVar178 - fVar157) + fVar157;
      fVar204 = (fVar210 - fVar204) * (float)local_418._0_4_ + fVar204;
      fVar205 = (fVar211 - fVar205) * (float)local_418._0_4_ + fVar205;
      fVar206 = (fVar225 - fVar206) * (float)local_418._0_4_ + fVar206;
      fVar209 = (fVar227 - fVar209) * (float)local_418._0_4_ + fVar209;
      fVar210 = ((((float)local_418._0_4_ * fVar241 + fVar230) - fVar210) * (float)local_418._0_4_ +
                fVar210) - fVar204;
      fVar211 = ((((float)local_418._0_4_ * fVar255 + fVar240) - fVar211) * (float)local_418._0_4_ +
                fVar211) - fVar205;
      fVar225 = ((((float)local_418._0_4_ * fVar258 + fVar276) - fVar225) * (float)local_418._0_4_ +
                fVar225) - fVar206;
      fVar227 = ((((float)local_418._0_4_ * fVar319 + fVar287) - fVar227) * (float)local_418._0_4_ +
                fVar227) - fVar209;
      fVar204 = (float)local_418._0_4_ * fVar210 + fVar204;
      fVar205 = (float)local_418._0_4_ * fVar211 + fVar205;
      fVar206 = (float)local_418._0_4_ * fVar225 + fVar206;
      fVar209 = (float)local_418._0_4_ * fVar227 + fVar209;
      fVar131 = (fVar160 - fVar131) * fStack_410 + fVar131;
      fVar132 = (fVar172 - fVar132) * fStack_410 + fVar132;
      fVar143 = (fVar173 - fVar143) * fStack_410 + fVar143;
      fVar157 = (fVar178 - fVar157) * fStack_410 + fVar157;
      fVar131 = (fVar239 - fVar131) * fStack_410 + fVar131;
      fVar132 = (fVar263 - fVar132) * fStack_410 + fVar132;
      fVar143 = (fVar280 - fVar143) * fStack_410 + fVar143;
      fVar157 = (fVar298 - fVar157) * fStack_410 + fVar157;
      fVar160 = (((fVar241 * fStack_410 + fVar230) - fVar239) * fStack_410 + fVar239) - fVar131;
      fVar172 = (((fVar255 * fStack_410 + fVar240) - fVar263) * fStack_410 + fVar263) - fVar132;
      fVar173 = (((fVar258 * fStack_410 + fVar276) - fVar280) * fStack_410 + fVar280) - fVar143;
      fVar178 = (((fVar319 * fStack_410 + fVar287) - fVar298) * fStack_410 + fVar298) - fVar157;
      auVar167._0_4_ = fStack_410 * fVar160 + fVar131;
      auVar167._4_4_ = fStack_410 * fVar172 + fVar132;
      auVar167._8_4_ = fStack_410 * fVar173 + fVar143;
      auVar167._12_4_ = fStack_410 * fVar178 + fVar157;
      fVar131 = fVar104 * 0.33333334;
      fVar210 = fVar210 * 3.0 * fVar131 + fVar204;
      fVar211 = fVar211 * 3.0 * fVar131 + fVar205;
      fVar225 = fVar225 * 3.0 * fVar131 + fVar206;
      fVar227 = fVar227 * 3.0 * fVar131 + fVar209;
      fVar241 = auVar167._0_4_ - fVar131 * fVar160 * 3.0;
      fVar255 = auVar167._4_4_ - fVar131 * fVar172 * 3.0;
      fVar258 = auVar167._8_4_ - fVar131 * fVar173 * 3.0;
      fVar319 = auVar167._12_4_ - fVar131 * fVar178 * 3.0;
      auVar22._4_8_ = auVar324._8_8_;
      auVar22._0_4_ = auVar167._4_4_;
      auVar321._0_8_ = auVar22._0_8_ << 0x20;
      auVar321._8_4_ = auVar167._8_4_;
      auVar321._12_4_ = auVar167._12_4_;
      auVar322._8_8_ = auVar167._8_8_;
      auVar322._0_8_ = auVar321._8_8_;
      fVar160 = (auVar167._8_4_ - auVar167._0_4_) + (fVar206 - fVar204);
      fVar172 = (auVar167._12_4_ - auVar167._4_4_) + (fVar209 - fVar205);
      auVar250._0_4_ = fVar255 * fVar172;
      auVar250._4_4_ = fVar255 * fVar172;
      auVar250._8_4_ = fVar319 * fVar172;
      auVar250._12_4_ = fVar319 * fVar172;
      fVar131 = fVar204 * fVar160 + fVar205 * fVar172;
      fVar132 = fVar206 * fVar160 + fVar209 * fVar172;
      fVar173 = fVar210 * fVar160 + fVar211 * fVar172;
      fVar178 = fVar225 * fVar160 + fVar227 * fVar172;
      fVar230 = fVar241 * fVar160 + auVar250._0_4_;
      auVar220._0_8_ = CONCAT44(fVar255 * fVar160 + auVar250._4_4_,fVar230);
      auVar220._8_4_ = fVar258 * fVar160 + auVar250._8_4_;
      auVar220._12_4_ = fVar319 * fVar160 + auVar250._12_4_;
      fVar157 = fVar160 * auVar167._0_4_ + fVar172 * auVar167._4_4_;
      fVar239 = fVar160 * auVar167._8_4_ + fVar172 * auVar167._12_4_;
      auVar23._4_8_ = auVar250._8_8_;
      auVar23._0_4_ = fVar211 * fVar160 + fVar211 * fVar172;
      auVar251._0_8_ = auVar23._0_8_ << 0x20;
      auVar251._8_4_ = fVar178;
      auVar251._12_4_ = fVar227 * fVar160 + fVar227 * fVar172;
      fVar143 = fVar173;
      if (fVar173 <= fVar131) {
        fVar143 = fVar131;
        fVar131 = fVar173;
      }
      auVar252._8_8_ = auVar251._8_8_;
      auVar252._0_8_ = auVar252._8_8_;
      auVar92._8_4_ = auVar220._8_4_;
      auVar92._0_8_ = auVar220._0_8_;
      auVar92._12_4_ = auVar220._12_4_;
      if (fVar157 <= fVar230) {
        auVar92._0_4_ = fVar157;
      }
      if (auVar92._0_4_ <= fVar131) {
        fVar131 = auVar92._0_4_;
      }
      auVar24._4_8_ = auVar92._8_8_;
      auVar24._0_4_ = fVar160 * auVar167._4_4_ + fVar172 * auVar167._4_4_;
      auVar93._0_8_ = auVar24._0_8_ << 0x20;
      auVar93._8_4_ = fVar239;
      auVar93._12_4_ = fVar160 * auVar167._12_4_ + fVar172 * auVar167._12_4_;
      if (fVar157 <= fVar230) {
        fVar157 = fVar230;
      }
      auVar94._8_8_ = auVar93._8_8_;
      auVar94._0_8_ = auVar94._8_8_;
      if (fVar157 <= fVar143) {
        fVar157 = fVar143;
      }
      if (fVar178 <= fVar132) {
        auVar252._0_4_ = fVar132;
        fVar132 = fVar178;
      }
      auVar124._8_4_ = auVar220._8_4_;
      auVar124._0_8_ = auVar220._8_8_;
      auVar124._12_4_ = auVar220._12_4_;
      if (fVar239 <= auVar220._8_4_) {
        auVar124._0_4_ = fVar239;
      }
      if (auVar124._0_4_ <= fVar132) {
        fVar132 = auVar124._0_4_;
      }
      if (fVar239 <= auVar220._8_4_) {
        auVar94._0_4_ = auVar220._8_4_;
      }
      if (auVar94._0_4_ <= auVar252._0_4_) {
        auVar94._0_4_ = auVar252._0_4_;
      }
      bVar59 = 3 < (uint)uVar55;
      uVar25 = (undefined3)(uVar62 >> 8);
      uVar53 = (ulong)CONCAT31(uVar25,bVar59);
      fVar143 = auVar94._0_4_;
      if ((0.0001 <= fVar131) || (fVar143 <= -0.0001)) break;
      goto LAB_00b1149b;
    }
  } while( true );
  if ((fVar132 < 0.0001 && -0.0001 < fVar157) ||
     ((fVar131 < 0.0001 && -0.0001 < fVar157 ||
      (auVar324 = auVar322, fVar132 < 0.0001 && -0.0001 < fVar143)))) {
LAB_00b1149b:
    bVar59 = bVar59 || fVar104 < 0.001;
    uVar53 = (ulong)CONCAT31(uVar25,bVar59);
    fVar172 = (float)(~-(uint)(fVar131 < 0.0) & 0x3f800000 | -(uint)(fVar131 < 0.0) & 0xbf800000);
    fVar173 = (float)(~-(uint)(fVar157 < 0.0) & 0x3f800000 | -(uint)(fVar157 < 0.0) & 0xbf800000);
    fVar160 = 0.0;
    if ((fVar172 == fVar173) && (!NAN(fVar172) && !NAN(fVar173))) {
      fVar160 = INFINITY;
    }
    fVar178 = 0.0;
    if ((fVar172 == fVar173) && (!NAN(fVar172) && !NAN(fVar173))) {
      fVar178 = -INFINITY;
    }
    fVar230 = (float)(~-(uint)(fVar132 < 0.0) & 0x3f800000 | -(uint)(fVar132 < 0.0) & 0xbf800000);
    if ((fVar172 != fVar230) || (fVar239 = fVar178, NAN(fVar172) || NAN(fVar230))) {
      if ((fVar132 != fVar131) || (NAN(fVar132) || NAN(fVar131))) {
        fVar132 = -fVar131 / (fVar132 - fVar131);
        fVar132 = (1.0 - fVar132) * 0.0 + fVar132;
        fVar239 = fVar132;
      }
      else {
        fVar132 = 0.0;
        if ((fVar131 != 0.0) || (fVar239 = 1.0, NAN(fVar131))) {
          fVar132 = INFINITY;
          fVar239 = -INFINITY;
        }
      }
      if (fVar132 <= fVar160) {
        fVar160 = fVar132;
      }
      if (fVar239 <= fVar178) {
        fVar239 = fVar178;
      }
    }
    fVar131 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar143 < 0.0) * 4);
    if ((fVar173 != fVar131) || (fVar132 = fVar239, NAN(fVar173) || NAN(fVar131))) {
      if ((fVar143 != fVar157) || (NAN(fVar143) || NAN(fVar157))) {
        fVar172 = -fVar157 / (fVar143 - fVar157);
        fVar172 = (1.0 - fVar172) * 0.0 + fVar172;
        fVar132 = fVar172;
      }
      else {
        fVar172 = 0.0;
        if ((fVar157 != 0.0) || (fVar132 = 1.0, NAN(fVar157))) {
          fVar172 = INFINITY;
          fVar132 = -INFINITY;
        }
      }
      if (fVar172 <= fVar160) {
        fVar160 = fVar172;
      }
      if (fVar132 <= fVar239) {
        fVar132 = fVar239;
      }
    }
    if ((fVar230 != fVar131) || (NAN(fVar230) || NAN(fVar131))) {
      fVar160 = (float)(~-(uint)(fVar160 < 1.0) & 0x3f800000 |
                       (uint)fVar160 & -(uint)(fVar160 < 1.0));
      fVar132 = (float)(~-(uint)(fVar132 < 1.0) & (uint)fVar132 |
                       -(uint)(fVar132 < 1.0) & 0x3f800000);
    }
    fVar157 = SUB164(ZEXT816(0x3f80000000000000),4);
    uVar62 = -(uint)(fVar132 < fVar157);
    fVar160 = (float)(~-(uint)(fVar160 < 0.0) & (uint)fVar160);
    fVar131 = (float)(~uVar62 & 0x3f800000 | (uint)fVar132 & uVar62);
    auVar324 = ZEXT816(0x3f80000000000000);
    _local_328 = auVar322;
    if (fVar160 <= fVar131) {
      fVar160 = fVar160 + -0.1;
      fVar131 = fVar131 + 0.1;
      uVar62 = -(uint)(fVar131 < fVar157);
      fVar160 = (float)(~-(uint)(fVar160 < 0.0) & (uint)fVar160);
      fVar131 = (float)(~uVar62 & 0x3f800000 | (uint)fVar131 & uVar62);
      fVar230 = 1.0 - fVar160;
      fVar239 = 1.0 - fVar160;
      fVar240 = 1.0 - fVar131;
      fVar263 = 1.0 - fVar131;
      fVar132 = fVar204 * fVar230 + fVar206 * fVar160;
      fVar157 = fVar205 * fVar239 + fVar209 * fVar160;
      fVar172 = fVar204 * fVar240 + fVar206 * fVar131;
      fVar173 = fVar205 * fVar263 + fVar209 * fVar131;
      fVar178 = fVar210 * fVar230 + fVar225 * fVar160;
      fVar204 = fVar211 * fVar239 + fVar227 * fVar160;
      fVar205 = fVar210 * fVar240 + fVar225 * fVar131;
      fVar206 = fVar211 * fVar263 + fVar227 * fVar131;
      fVar209 = fVar241 * fVar230 + fVar258 * fVar160;
      fVar210 = fVar255 * fVar239 + fVar319 * fVar160;
      fVar211 = fVar241 * fVar240 + fVar258 * fVar131;
      fVar225 = fVar255 * fVar263 + fVar319 * fVar131;
      fVar227 = fVar230 * auVar167._0_4_ + auVar167._8_4_ * fVar160;
      fVar241 = fVar239 * auVar167._4_4_ + auVar167._12_4_ * fVar160;
      fVar255 = fVar240 * auVar167._0_4_ + auVar167._8_4_ * fVar131;
      fVar258 = fVar263 * auVar167._4_4_ + auVar167._12_4_ * fVar131;
      fVar319 = (float)local_418._4_4_ * (1.0 - fVar131);
      local_418._4_4_ = (float)local_418._4_4_ * (1.0 - fVar160) + fStack_40c * fVar160;
      fStack_40c = fVar319 + fStack_40c * fVar131;
      fVar104 = 1.0 / fVar104;
      auVar125._0_4_ = fVar255 - fVar227;
      auVar125._4_4_ = fVar258 - fVar241;
      auVar125._8_4_ = fVar255 - fVar255;
      auVar125._12_4_ = fVar258 - fVar258;
      auVar153._0_8_ = CONCAT44(fVar225 - fVar210,fVar211 - fVar209);
      auVar153._8_4_ = fVar211 - fVar211;
      auVar153._12_4_ = fVar225 - fVar225;
      auVar199._0_4_ = fVar205 - fVar178;
      auVar199._4_4_ = fVar206 - fVar204;
      auVar199._8_4_ = fVar205 - fVar205;
      auVar199._12_4_ = fVar206 - fVar206;
      auVar253._0_8_ = CONCAT44((fVar204 - fVar157) * 3.0,(fVar178 - fVar132) * 3.0);
      auVar253._8_4_ = (fVar205 - fVar172) * 3.0;
      auVar253._12_4_ = (fVar206 - fVar173) * 3.0;
      auVar168._0_8_ = CONCAT44((fVar210 - fVar204) * 3.0,(fVar209 - fVar178) * 3.0);
      auVar168._8_4_ = (fVar211 - fVar205) * 3.0;
      auVar168._12_4_ = (fVar225 - fVar206) * 3.0;
      auVar294._0_4_ = (fVar227 - fVar209) * 3.0;
      auVar294._4_4_ = (fVar241 - fVar210) * 3.0;
      auVar294._8_4_ = (fVar255 - fVar211) * 3.0;
      auVar294._12_4_ = (fVar258 - fVar225) * 3.0;
      auVar221._8_4_ = auVar168._8_4_;
      auVar221._0_8_ = auVar168._0_8_;
      auVar221._12_4_ = auVar168._12_4_;
      auVar134 = minps(auVar221,auVar294);
      auVar68 = maxps(auVar168,auVar294);
      auVar272._8_4_ = auVar253._8_4_;
      auVar272._0_8_ = auVar253._0_8_;
      auVar272._12_4_ = auVar253._12_4_;
      auVar136 = minps(auVar272,auVar134);
      auVar120 = maxps(auVar253,auVar68);
      auVar26._4_8_ = auVar68._8_8_;
      auVar26._0_4_ = auVar136._4_4_;
      auVar169._0_8_ = auVar26._0_8_ << 0x20;
      auVar169._8_4_ = auVar136._8_4_;
      auVar169._12_4_ = auVar136._12_4_;
      auVar170._8_8_ = auVar136._8_8_;
      auVar170._0_8_ = auVar169._8_8_;
      auVar27._4_8_ = auVar134._8_8_;
      auVar27._0_4_ = auVar120._4_4_;
      auVar222._0_8_ = auVar27._0_8_ << 0x20;
      auVar222._8_4_ = auVar120._8_4_;
      auVar222._12_4_ = auVar120._12_4_;
      auVar223._8_8_ = auVar120._8_8_;
      auVar223._0_8_ = auVar222._8_8_;
      auVar134 = minps(auVar136,auVar170);
      auVar68 = maxps(auVar120,auVar223);
      fVar276 = auVar134._0_4_ * fVar104;
      fVar280 = auVar134._4_4_ * fVar104;
      fVar287 = auVar134._8_4_ * fVar104;
      fVar298 = auVar134._12_4_ * fVar104;
      fVar211 = fVar104 * auVar68._0_4_;
      fVar227 = fVar104 * auVar68._4_4_;
      fVar255 = fVar104 * auVar68._8_4_;
      fVar104 = fVar104 * auVar68._12_4_;
      fVar240 = 1.0 / (fStack_40c - (float)local_418._4_4_);
      auVar95._0_8_ = CONCAT44(fVar173 - fVar157,fVar172 - fVar132);
      auVar95._8_4_ = fVar172 - fVar172;
      auVar95._12_4_ = fVar173 - fVar173;
      auVar234._8_4_ = auVar95._8_4_;
      auVar234._0_8_ = auVar95._0_8_;
      auVar234._12_4_ = auVar95._12_4_;
      auVar120 = minps(auVar234,auVar199);
      auVar68 = maxps(auVar95,auVar199);
      auVar142._8_4_ = auVar153._8_4_;
      auVar142._0_8_ = auVar153._0_8_;
      auVar142._12_4_ = auVar153._12_4_;
      auVar134 = minps(auVar142,auVar125);
      auVar120 = minps(auVar120,auVar134);
      auVar134 = maxps(auVar153,auVar125);
      auVar68 = maxps(auVar68,auVar134);
      fVar230 = auVar120._0_4_ * fVar240;
      fVar239 = auVar120._4_4_ * fVar240;
      fVar263 = fVar240 * auVar68._0_4_;
      fVar240 = fVar240 * auVar68._4_4_;
      auVar224._4_4_ = fStack_40c;
      auVar224._0_4_ = fStack_410;
      auVar224._8_4_ = fVar130;
      auVar224._12_4_ = fVar106;
      fVar205 = ((float)local_418._0_4_ + fStack_410) * 0.5;
      fVar206 = ((float)local_418._4_4_ + fStack_40c) * 0.5;
      fVar209 = (fStack_410 + fVar130) * 0.0;
      fVar210 = (fStack_40c + fVar106) * 0.0;
      fVar131 = local_88 * fVar205 + (float)local_1f8;
      fVar132 = fStack_84 * fVar205 + local_1f8._4_4_;
      fVar157 = fStack_80 * fVar205 + fStack_1f0;
      fVar160 = fStack_7c * fVar205 + fStack_1ec;
      fVar172 = local_98 * fVar205 + local_288;
      fVar173 = fStack_94 * fVar205 + fStack_284;
      fVar178 = fStack_90 * fVar205 + (float)uStack_280;
      fVar204 = fStack_8c * fVar205 + uStack_280._4_4_;
      fVar131 = (fVar172 - fVar131) * fVar205 + fVar131;
      fVar132 = (fVar173 - fVar132) * fVar205 + fVar132;
      fVar157 = (fVar178 - fVar157) * fVar205 + fVar157;
      fVar160 = (fVar204 - fVar160) * fVar205 + fVar160;
      fVar172 = (((local_a8 * fVar205 + (float)local_298) - fVar172) * fVar205 + fVar172) - fVar131;
      fVar173 = (((fStack_a4 * fVar205 + local_298._4_4_) - fVar173) * fVar205 + fVar173) - fVar132;
      fVar178 = (((fStack_a0 * fVar205 + fStack_290) - fVar178) * fVar205 + fVar178) - fVar157;
      fVar204 = (((fStack_9c * fVar205 + fStack_28c) - fVar204) * fVar205 + fVar204) - fVar160;
      fVar131 = fVar205 * fVar172 + fVar131;
      fVar132 = fVar205 * fVar173 + fVar132;
      fVar172 = fVar172 * 3.0;
      fVar173 = fVar173 * 3.0;
      fVar157 = (fVar205 * fVar178 + fVar157) - fVar131;
      fVar160 = (fVar205 * fVar204 + fVar160) - fVar132;
      fVar172 = (fVar178 * 3.0 - fVar172) * fVar206 + fVar172;
      fVar173 = (fVar204 * 3.0 - fVar173) * fVar206 + fVar173;
      auVar154._0_8_ = CONCAT44(fVar172,fVar157) ^ 0x80000000;
      auVar154._8_4_ = fVar172;
      auVar154._12_4_ = fVar172;
      fVar299 = (float)local_418._0_4_ - fVar205;
      fVar301 = (float)local_418._4_4_ - fVar206;
      fVar303 = fStack_410 - fVar209;
      fVar313 = fStack_40c - fVar210;
      fVar315 = fStack_410 - fVar205;
      fVar317 = fStack_40c - fVar206;
      fVar130 = fVar130 - fVar209;
      fVar106 = fVar106 - fVar210;
      fVar131 = fVar157 * fVar206 + fVar131;
      fVar132 = fVar160 * fVar206 + fVar132;
      auVar171._0_8_ = CONCAT44(fVar173,fVar160) ^ 0x8000000000000000;
      auVar171._8_4_ = -fVar173;
      auVar171._12_4_ = -fVar173;
      auVar96._0_4_ = fVar160 * fVar172 - fVar173 * fVar157;
      auVar96._4_4_ = auVar96._0_4_;
      auVar96._8_4_ = auVar96._0_4_;
      auVar96._12_4_ = auVar96._0_4_;
      auVar134 = divps(auVar171,auVar96);
      auVar68 = divps(auVar154,auVar96);
      fVar209 = auVar134._0_4_;
      fVar210 = auVar134._4_4_;
      fVar178 = auVar68._0_4_;
      fVar204 = auVar68._4_4_;
      fVar205 = fVar205 - (fVar132 * fVar178 + fVar131 * fVar209);
      fVar172 = fVar206 - (fVar132 * fVar204 + fVar131 * fVar210);
      fVar173 = fVar206 - (fVar132 * auVar68._8_4_ + fVar131 * auVar134._8_4_);
      fVar206 = fVar206 - (fVar132 * auVar68._12_4_ + fVar131 * auVar134._12_4_);
      auVar126._0_8_ = CONCAT44(fVar210 * fVar230,fVar210 * fVar276);
      auVar126._8_4_ = fVar210 * fVar280;
      auVar126._12_4_ = fVar210 * fVar239;
      auVar97._0_4_ = fVar210 * fVar211;
      auVar97._4_4_ = fVar210 * fVar263;
      auVar97._8_4_ = fVar210 * fVar227;
      auVar97._12_4_ = fVar210 * fVar240;
      auVar331._8_4_ = auVar126._8_4_;
      auVar331._0_8_ = auVar126._0_8_;
      auVar331._12_4_ = auVar126._12_4_;
      auVar136 = minps(auVar331,auVar97);
      auVar68 = maxps(auVar97,auVar126);
      auVar200._0_8_ = CONCAT44(fVar204 * fVar239,fVar204 * fVar280);
      auVar200._8_4_ = fVar204 * fVar287;
      auVar200._12_4_ = fVar204 * fVar298;
      auVar127._0_4_ = fVar204 * fVar227;
      auVar127._4_4_ = fVar204 * fVar240;
      auVar127._8_4_ = fVar204 * fVar255;
      auVar127._12_4_ = fVar204 * fVar104;
      auVar273._8_4_ = auVar200._8_4_;
      auVar273._0_8_ = auVar200._0_8_;
      auVar273._12_4_ = auVar200._12_4_;
      auVar120 = minps(auVar273,auVar127);
      auVar134 = maxps(auVar127,auVar200);
      fVar131 = 0.0 - (auVar134._0_4_ + auVar68._0_4_);
      fVar132 = 1.0 - (auVar134._4_4_ + auVar68._4_4_);
      fVar157 = 0.0 - (auVar134._8_4_ + auVar68._8_4_);
      fVar160 = 0.0 - (auVar134._12_4_ + auVar68._12_4_);
      fVar225 = 0.0 - (auVar120._0_4_ + auVar136._0_4_);
      fVar241 = 1.0 - (auVar120._4_4_ + auVar136._4_4_);
      fVar258 = 0.0 - (auVar120._8_4_ + auVar136._8_4_);
      fVar319 = 0.0 - (auVar120._12_4_ + auVar136._12_4_);
      auVar128._0_8_ = CONCAT44(fVar301 * fVar132,fVar299 * fVar131);
      auVar128._8_4_ = fVar303 * fVar157;
      auVar128._12_4_ = fVar313 * fVar160;
      auVar295._0_8_ = CONCAT44(fVar230 * fVar209,fVar276 * fVar209);
      auVar295._8_4_ = fVar280 * fVar209;
      auVar295._12_4_ = fVar239 * fVar209;
      auVar201._0_4_ = fVar209 * fVar211;
      auVar201._4_4_ = fVar209 * fVar263;
      auVar201._8_4_ = fVar209 * fVar227;
      auVar201._12_4_ = fVar209 * fVar240;
      auVar274._8_4_ = auVar295._8_4_;
      auVar274._0_8_ = auVar295._0_8_;
      auVar274._12_4_ = auVar295._12_4_;
      auVar134 = minps(auVar274,auVar201);
      auVar68 = maxps(auVar201,auVar295);
      auVar235._0_8_ = CONCAT44(fVar239 * fVar178,fVar280 * fVar178);
      auVar235._8_4_ = fVar287 * fVar178;
      auVar235._12_4_ = fVar298 * fVar178;
      auVar296._0_4_ = fVar178 * fVar227;
      auVar296._4_4_ = fVar178 * fVar240;
      auVar296._8_4_ = fVar178 * fVar255;
      auVar296._12_4_ = fVar178 * fVar104;
      auVar330._8_4_ = auVar235._8_4_;
      auVar330._0_8_ = auVar235._0_8_;
      auVar330._12_4_ = auVar235._12_4_;
      auVar136 = minps(auVar330,auVar296);
      auVar275._0_4_ = fVar299 * fVar225;
      auVar275._4_4_ = fVar301 * fVar241;
      auVar275._8_4_ = fVar303 * fVar258;
      auVar275._12_4_ = fVar313 * fVar319;
      auVar98._0_8_ = CONCAT44(fVar132 * fVar317,fVar131 * fVar315);
      auVar98._8_4_ = fVar157 * fVar130;
      auVar98._12_4_ = fVar160 * fVar106;
      auVar208._0_4_ = fVar225 * fVar315;
      auVar208._4_4_ = fVar241 * fVar317;
      auVar208._8_4_ = fVar258 * fVar130;
      auVar208._12_4_ = fVar319 * fVar106;
      auVar120 = maxps(auVar296,auVar235);
      fVar104 = 1.0 - (auVar120._0_4_ + auVar68._0_4_);
      fVar131 = 0.0 - (auVar120._4_4_ + auVar68._4_4_);
      fVar132 = 0.0 - (auVar120._8_4_ + auVar68._8_4_);
      fVar157 = 0.0 - (auVar120._12_4_ + auVar68._12_4_);
      fVar160 = 1.0 - (auVar136._0_4_ + auVar134._0_4_);
      fVar211 = 0.0 - (auVar136._4_4_ + auVar134._4_4_);
      fVar225 = 0.0 - (auVar136._8_4_ + auVar134._8_4_);
      fVar227 = 0.0 - (auVar136._12_4_ + auVar134._12_4_);
      auVar236._0_8_ = CONCAT44(fVar301 * fVar131,fVar299 * fVar104);
      auVar236._8_4_ = fVar303 * fVar132;
      auVar236._12_4_ = fVar313 * fVar157;
      auVar312._0_4_ = fVar299 * fVar160;
      auVar312._4_4_ = fVar301 * fVar211;
      auVar312._8_4_ = fVar303 * fVar225;
      auVar312._12_4_ = fVar313 * fVar227;
      auVar202._0_8_ = CONCAT44(fVar131 * fVar317,fVar104 * fVar315);
      auVar202._8_4_ = fVar132 * fVar130;
      auVar202._12_4_ = fVar157 * fVar106;
      auVar254._0_4_ = fVar160 * fVar315;
      auVar254._4_4_ = fVar211 * fVar317;
      auVar254._8_4_ = fVar225 * fVar130;
      auVar254._12_4_ = fVar227 * fVar106;
      auVar297._8_4_ = auVar236._8_4_;
      auVar297._0_8_ = auVar236._0_8_;
      auVar297._12_4_ = auVar236._12_4_;
      auVar68 = minps(auVar297,auVar312);
      auVar323._8_4_ = auVar202._8_4_;
      auVar323._0_8_ = auVar202._0_8_;
      auVar323._12_4_ = auVar202._12_4_;
      auVar324 = minps(auVar323,auVar254);
      auVar249 = minps(auVar68,auVar324);
      auVar134 = maxps(auVar312,auVar236);
      auVar68 = maxps(auVar254,auVar202);
      auVar120 = maxps(auVar68,auVar134);
      auVar237._8_4_ = auVar128._8_4_;
      auVar237._0_8_ = auVar128._0_8_;
      auVar237._12_4_ = auVar128._12_4_;
      auVar134 = minps(auVar237,auVar275);
      auVar203._8_4_ = auVar98._8_4_;
      auVar203._0_8_ = auVar98._0_8_;
      auVar203._12_4_ = auVar98._12_4_;
      auVar68 = minps(auVar203,auVar208);
      auVar134 = minps(auVar134,auVar68);
      auVar136 = maxps(auVar275,auVar128);
      auVar68 = maxps(auVar208,auVar98);
      auVar68 = maxps(auVar68,auVar136);
      auVar238._0_4_ = auVar249._4_4_ + auVar249._0_4_ + fVar205;
      auVar238._4_4_ = auVar134._4_4_ + auVar134._0_4_ + fVar172;
      auVar238._8_4_ = auVar249._8_4_ + auVar249._4_4_ + fVar173;
      auVar238._12_4_ = auVar249._12_4_ + auVar134._4_4_ + fVar206;
      fVar104 = auVar120._4_4_ + auVar120._0_4_ + fVar205;
      fVar106 = auVar68._4_4_ + auVar68._0_4_ + fVar172;
      auVar99._4_4_ = fVar106;
      auVar99._0_4_ = fVar104;
      auVar134 = maxps(_local_418,auVar238);
      auVar99._8_4_ = auVar120._8_4_ + auVar120._4_4_ + fVar173;
      auVar99._12_4_ = auVar120._12_4_ + auVar68._4_4_ + fVar206;
      auVar68 = minps(auVar99,auVar224);
      iVar61 = -(uint)(auVar68._0_4_ < auVar134._0_4_);
      iVar63 = -(uint)(auVar68._4_4_ < auVar134._4_4_);
      auVar101._4_4_ = iVar63;
      auVar101._0_4_ = iVar61;
      auVar101._8_4_ = iVar63;
      auVar101._12_4_ = iVar63;
      auVar100._8_8_ = auVar101._8_8_;
      auVar100._4_4_ = iVar61;
      auVar100._0_4_ = iVar61;
      iVar61 = movmskpd((uint)(fVar143 < 0.0),auVar100);
      if (iVar61 == 0) {
        bVar51 = 0;
        if (((float)local_418._0_4_ < auVar238._0_4_) && (fVar104 < fStack_410)) {
          bVar51 = -(fVar106 < fStack_40c) & (float)local_418._4_4_ < auVar238._4_4_;
        }
        bVar51 = bVar59 | bVar51;
        uVar53 = (ulong)CONCAT31(uVar25,bVar51);
        if (bVar51 != 1) goto LAB_00b10ac6;
        uVar53 = 200;
        do {
          fVar104 = 1.0 - fVar205;
          fVar132 = fVar205 * fVar205 * fVar205;
          fVar131 = fVar205 * fVar205 * 3.0 * fVar104;
          fVar106 = fVar104 * fVar104 * fVar104;
          fVar143 = fVar205 * 3.0 * fVar104 * fVar104;
          fVar130 = fVar106 * (float)local_1f8 +
                    fVar143 * local_288 + fVar131 * (float)local_298 + fVar132 * fVar146;
          fVar104 = fVar106 * local_1f8._4_4_ +
                    fVar143 * fStack_284 + fVar131 * local_298._4_4_ + fVar132 * fVar155;
          fVar130 = ((fVar106 * fStack_1f0 +
                     fVar143 * (float)uStack_280 + fVar131 * fStack_290 + fVar132 * fVar105) -
                    fVar130) * fVar172 + fVar130;
          fVar104 = ((fVar106 * fStack_1ec +
                     fVar143 * uStack_280._4_4_ + fVar131 * fStack_28c + fVar132 * fVar67) - fVar104
                    ) * fVar172 + fVar104;
          fVar205 = fVar205 - (fVar104 * fVar178 + fVar130 * fVar209);
          fVar172 = fVar172 - (fVar104 * fVar204 + fVar130 * fVar210);
          fVar130 = (float)((uint)fVar130 & (uint)DAT_01f7b6c0);
          fVar104 = (float)((uint)fVar104 & DAT_01f7b6c0._4_4_);
          if (fVar104 <= fVar130) {
            fVar104 = fVar130;
          }
          auVar324 = _DAT_01f7b6c0;
          if (fVar104 < fVar144) {
            if ((((0.0 <= fVar205) && (fVar205 <= 1.0)) && (0.0 <= fVar172)) && (fVar172 <= 1.0)) {
              fVar104 = (pre->ray_space).vx.field_0.m128[2];
              fVar106 = (pre->ray_space).vy.field_0.m128[2];
              fVar130 = (pre->ray_space).vz.field_0.m128[2];
              fVar131 = (ray->org).field_0.m128[0];
              fVar132 = (ray->org).field_0.m128[1];
              fVar143 = (ray->org).field_0.m128[2];
              fVar206 = 1.0 - fVar172;
              fVar204 = 1.0 - fVar205;
              fVar157 = fVar204 * fVar204 * fVar204;
              fVar160 = fVar205 * 3.0 * fVar204 * fVar204;
              fVar178 = fVar205 * fVar205 * fVar205;
              fVar173 = fVar205 * fVar205 * 3.0 * fVar204;
              fVar104 = (((fStack_360 - fVar143) * fVar130 +
                         (fStack_364 - fVar132) * fVar106 + (local_368 - fVar131) * fVar104) *
                         fVar206 +
                        ((fStack_350 - fVar143) * fVar130 +
                        (fStack_354 - fVar132) * fVar106 + (local_358 - fVar131) * fVar104) *
                        fVar172) * fVar157 +
                        (((fStack_370 - fVar143) * fVar130 +
                         (fStack_374 - fVar132) * fVar106 + (local_378 - fVar131) * fVar104) *
                         fVar206 +
                        ((fStack_340 - fVar143) * fVar130 +
                        (fStack_344 - fVar132) * fVar106 + (local_348 - fVar131) * fVar104) *
                        fVar172) * fVar160 +
                        (((fStack_390 - fVar143) * fVar130 +
                         (fStack_394 - fVar132) * fVar106 + (local_398 - fVar131) * fVar104) *
                         fVar206 +
                        ((fStack_3b0 - fVar143) * fVar130 +
                        (fStack_3b4 - fVar132) * fVar106 + (local_3b8 - fVar131) * fVar104) *
                        fVar172) * fVar173 +
                        (fVar206 * ((fStack_380 - fVar143) * fVar130 +
                                   (fStack_384 - fVar132) * fVar106 +
                                   (local_388 - fVar131) * fVar104) +
                        ((fStack_200 - fVar143) * fVar130 +
                        (fStack_204 - fVar132) * fVar106 + (local_208 - fVar131) * fVar104) *
                        fVar172) * fVar178;
              if ((ray->org).field_0.m128[3] <= fVar104) {
                fVar106 = ray->tfar;
                auVar324 = ZEXT416((uint)fVar106);
                if (fVar104 <= fVar106) {
                  fVar143 = 1.0 - fVar172;
                  fVar206 = 1.0 - fVar172;
                  fVar209 = 1.0 - fVar172;
                  fVar130 = local_378 * fVar143 + local_348 * fVar172;
                  fVar131 = fStack_374 * fVar206 + fStack_344 * fVar172;
                  fVar132 = fStack_370 * fVar209 + fStack_340 * fVar172;
                  fVar210 = local_398 * fVar143 + local_3b8 * fVar172;
                  fVar225 = fStack_394 * fVar206 + fStack_3b4 * fVar172;
                  fVar241 = fStack_390 * fVar209 + fStack_3b0 * fVar172;
                  fVar211 = fVar210 - fVar130;
                  fVar227 = fVar225 - fVar131;
                  fVar255 = fVar241 - fVar132;
                  fVar130 = (((fVar130 - (local_368 * fVar143 + local_358 * fVar172)) * fVar204 +
                             fVar205 * fVar211) * fVar204 +
                            (fVar211 * fVar204 +
                            ((fVar143 * local_388 + fVar172 * local_208) - fVar210) * fVar205) *
                            fVar205) * 3.0;
                  fVar131 = (((fVar131 - (fStack_364 * fVar206 + fStack_354 * fVar172)) * fVar204 +
                             fVar205 * fVar227) * fVar204 +
                            (fVar227 * fVar204 +
                            ((fVar206 * fStack_384 + fVar172 * fStack_204) - fVar225) * fVar205) *
                            fVar205) * 3.0;
                  fVar132 = (((fVar132 - (fStack_360 * fVar209 + fStack_350 * fVar172)) * fVar204 +
                             fVar205 * fVar255) * fVar204 +
                            (fVar255 * fVar204 +
                            ((fVar209 * fStack_380 + fVar172 * fStack_200) - fVar241) * fVar205) *
                            fVar205) * 3.0;
                  pGVar14 = (context->scene->geometries).items[local_330].ptr;
                  if ((pGVar14->mask & ray->mask) == 0) {
LAB_00b12189:
                    uVar53 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (uVar53 = CONCAT71((int7)((ulong)context->args >> 8),1),
                          pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar143 = fVar157 * local_178 +
                              fVar160 * local_188 + fVar173 * local_198 + fVar178 * local_1a8;
                    fVar204 = fVar157 * fStack_174 +
                              fVar160 * fStack_184 + fVar173 * fStack_194 + fVar178 * fStack_1a4;
                    fVar157 = fVar157 * fStack_170 +
                              fVar160 * fStack_180 + fVar173 * fStack_190 + fVar178 * fStack_1a0;
                    local_1d8 = CONCAT44(fVar143 * fVar132 - fVar130 * fVar157,
                                         fVar157 * fVar131 - fVar132 * fVar204);
                    local_1d0 = fVar204 * fVar130 - fVar131 * fVar143;
                    local_1cc = fVar205;
                    fStack_1c8 = fVar172;
                    local_1c4 = (int)local_278;
                    local_1c0 = (int)local_330;
                    local_1bc = context->user->instID[0];
                    local_1b8 = context->user->instPrimID[0];
                    ray->tfar = fVar104;
                    local_3bc = 0xffffffff;
                    local_268.valid = &local_3bc;
                    local_268.geometryUserPtr = pGVar14->userPtr;
                    local_268.context = context->user;
                    local_268.hit = (RTCHitN *)&local_1d8;
                    local_268.N = 1;
                    local_3a8._0_4_ = (int)uVar58;
                    local_268.ray = (RTCRayN *)ray;
                    if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar14->occlusionFilterN)(&local_268);
                      uVar58 = (ulong)(uint)local_3a8._0_4_;
                      if (*local_268.valid != 0) goto LAB_00b1212f;
LAB_00b1217e:
                      ray->tfar = fVar106;
                      goto LAB_00b12189;
                    }
LAB_00b1212f:
                    p_Var54 = context->args->filter;
                    if ((p_Var54 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var54)(&local_268);
                      uVar58 = (ulong)(uint)local_3a8._0_4_;
                      p_Var54 = (RTCFilterFunctionN)local_268.valid;
                      if (*local_268.valid == 0) goto LAB_00b1217e;
                    }
                    uVar53 = CONCAT71((int7)((ulong)p_Var54 >> 8),1);
                  }
                  uVar58 = CONCAT71((int7)(uVar58 >> 8),(byte)uVar58 | (byte)uVar53);
                }
              }
            }
            break;
          }
          uVar53 = uVar53 - 1;
        } while (uVar53 != 0);
      }
    }
  }
  goto LAB_00b11138;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }